

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::sse42::InstanceArrayIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive_conflict4 *prim)

{
  RayHitK<4> *pRVar1;
  undefined8 uVar2;
  RTCFormat RVar3;
  InstanceArray *this;
  RTCRayQueryContext *pRVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  RawBufferView *pRVar7;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar8;
  Accel *pAVar9;
  undefined4 extraout_EDX;
  uint uVar10;
  RawBufferView *pRVar11;
  int iVar12;
  long lVar13;
  RTCRayQueryContext RVar14;
  uint uVar37;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar15;
  ulong uVar40;
  undefined1 auVar25 [16];
  uint uVar36;
  uint uVar41;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar38;
  uint uVar42;
  undefined1 auVar34 [16];
  uint uVar39;
  uint uVar43;
  undefined1 auVar35 [16];
  undefined1 auVar44 [12];
  vfloat4 v_14;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar78;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 uVar79;
  undefined4 uVar101;
  undefined4 uVar102;
  vfloat4 v_9;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined4 uVar103;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar126 [12];
  float fVar124;
  float fVar138;
  undefined1 in_XMM4 [16];
  vfloat4 v_4;
  undefined1 auVar127 [16];
  float fVar125;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar144;
  float fVar184;
  float fVar185;
  undefined1 auVar145 [16];
  float fVar186;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar187;
  float fVar188;
  float fVar193;
  float fVar195;
  undefined1 in_XMM6 [16];
  undefined1 auVar189 [16];
  float fVar194;
  float fVar196;
  float fVar197;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar211;
  float fVar212;
  undefined1 in_XMM7 [16];
  vfloat4 v_20;
  float fVar213;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [12];
  undefined1 in_XMM8 [16];
  vfloat4 v_2;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar228 [12];
  float fVar226;
  float fVar227;
  float fVar237;
  undefined1 in_XMM9 [16];
  vfloat4 v_16;
  undefined1 auVar229 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar244 [12];
  float fVar243;
  float fVar251;
  undefined1 in_XMM10 [16];
  vfloat4 v_12;
  undefined1 auVar245 [16];
  float fVar253;
  float fVar254;
  undefined1 auVar246 [16];
  float fVar252;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar255 [12];
  undefined1 auVar256 [12];
  undefined1 auVar257 [12];
  undefined1 in_XMM11 [16];
  vfloat4 v_11;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar266;
  float fVar280;
  float fVar282;
  vfloat4 v;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  float fVar284;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined4 uVar281;
  undefined4 uVar283;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar285;
  float fVar286;
  float fVar294;
  float fVar295;
  undefined1 in_XMM13 [16];
  vfloat4 v_1;
  float fVar297;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar296;
  float fVar298;
  float fVar299;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  int iVar300;
  float fVar302;
  int iVar309;
  int iVar313;
  undefined1 in_XMM14 [16];
  vfloat4 v_7;
  float fVar301;
  float fVar310;
  float fVar314;
  int iVar316;
  float fVar317;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar311;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar312;
  float fVar315;
  float fVar318;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar319;
  float fVar326;
  float fVar328;
  undefined1 in_XMM15 [16];
  vfloat4 v_15;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  float fVar320;
  float fVar327;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  vfloat4 v_5;
  vfloat4 v_8;
  RayQueryContext newcontext;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  RTCIntersectArguments *local_58;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  
  v_15.field_0._0_12_ = in_XMM15._0_12_;
  aVar8 = valid_i->field_0;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar9 = InstanceArray::getObject(this,(ulong)prim->primID_);
  auVar228 = in_XMM9._0_12_;
  auVar214 = in_XMM8._0_12_;
  auVar244 = in_XMM10._0_12_;
  auVar255 = in_XMM11._0_12_;
  auVar126 = in_XMM4._0_12_;
  if (pAVar9 != (Accel *)0x0) {
    uVar10 = (this->super_Geometry).mask;
    auVar145._0_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x90)) == 0);
    auVar145._4_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x94)) == 0);
    auVar145._8_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x98)) == 0);
    auVar145._12_4_ = -(uint)((uVar10 & *(uint *)(ray + 0x9c)) == 0);
    local_48 = ~auVar145 & (undefined1  [16])aVar8;
    uVar10 = movmskps(extraout_EDX,local_48);
    if ((uVar10 != 0) && (pRVar4 = context->user, pRVar4->instID[0] == 0xffffffff)) {
      RVar14.instPrimID[0] = (*prim).primID_;
      RVar14.instID[0] = (*prim).instID_;
      *pRVar4 = RVar14;
      uVar15 = (ulong)prim->primID_;
      uVar36 = (uint)(byte)(this->super_Geometry).field_8.field_0x1;
      auVar145 = local_48;
      if (uVar36 == 1) {
        fVar266 = (this->super_Geometry).fnumTimeSegments;
        fVar280 = (this->super_Geometry).time_range.lower;
        auVar268._0_4_ = (this->super_Geometry).time_range.upper - fVar280;
        auVar129._4_4_ = fVar280;
        auVar129._0_4_ = fVar280;
        auVar129._8_4_ = fVar280;
        auVar129._12_4_ = fVar280;
        auVar217._0_4_ = *(float *)(ray + 0x70) - fVar280;
        auVar217._4_4_ = *(float *)(ray + 0x74) - fVar280;
        auVar217._8_4_ = *(float *)(ray + 0x78) - fVar280;
        auVar217._12_4_ = *(float *)(ray + 0x7c) - fVar280;
        auVar268._4_4_ = auVar268._0_4_;
        auVar268._8_4_ = auVar268._0_4_;
        auVar268._12_4_ = auVar268._0_4_;
        auVar107 = divps(auVar217,auVar268);
        auVar260._0_4_ = auVar107._0_4_ * fVar266;
        auVar260._4_4_ = auVar107._4_4_ * fVar266;
        auVar260._8_4_ = auVar107._8_4_ * fVar266;
        auVar260._12_4_ = auVar107._12_4_ * fVar266;
        auVar129 = roundps(auVar129,auVar260,1);
        auVar107._0_4_ = fVar266 + -1.0;
        auVar107._4_4_ = auVar107._0_4_;
        auVar107._8_4_ = auVar107._0_4_;
        auVar107._12_4_ = auVar107._0_4_;
        auVar107 = minps(auVar129,auVar107);
        auVar107 = maxps(auVar107,ZEXT816(0));
        auVar304._0_4_ = auVar260._0_4_ - auVar107._0_4_;
        auVar304._4_4_ = auVar260._4_4_ - auVar107._4_4_;
        auVar304._8_4_ = auVar260._8_4_ - auVar107._8_4_;
        auVar304._12_4_ = auVar260._12_4_ - auVar107._12_4_;
        iVar300 = (int)auVar107._0_4_;
        iVar309 = (int)auVar107._4_4_;
        iVar313 = (int)auVar107._8_4_;
        iVar316 = (int)auVar107._12_4_;
        local_68 = (Accel *)CONCAT44(iVar309,iVar300);
        uStack_60 = (RTCRayQueryContext *)CONCAT44(iVar316,iVar313);
        lVar13 = 0;
        if ((uVar10 & 0xff) != 0) {
          for (; ((uVar10 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        iVar12 = *(int *)((long)&local_68 + lVar13 * 4);
        pRVar11 = (RawBufferView *)(long)iVar12;
        auVar325._0_4_ = -(uint)(iVar12 == iVar300);
        auVar325._4_4_ = -(uint)(iVar12 == iVar309);
        auVar325._8_4_ = -(uint)(iVar12 == iVar313);
        auVar325._12_4_ = -(uint)(iVar12 == iVar316);
        iVar12 = movmskps(0x100,~auVar325 & local_48);
        auVar322 = auVar304;
        _local_2a8 = local_48;
        if (iVar12 == 0) {
          pRVar5 = (this->l2w_buf).items;
          pRVar7 = pRVar5 + (long)pRVar11;
          RVar3 = pRVar5[(long)pRVar11].format;
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
            auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
            auVar274 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
            auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
            in_XMM13 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
            auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
            in_XMM8 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar268._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
            auVar268._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar13);
            auVar268._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
            auVar268._12_4_ = 0;
            auVar274._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
            auVar274._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
            auVar274._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
            auVar274._12_4_ = 0;
            in_XMM13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            in_XMM13._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            in_XMM13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            in_XMM13._12_4_ = 0;
            in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
            in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
            in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
            in_XMM8._12_4_ = 0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar289._8_8_ = 0;
            auVar289._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
            auVar129 = insertps(auVar289,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
            auVar202._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
            auVar202._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar202._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
            auVar202._12_4_ = 0;
            auVar220._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar220._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar220._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar220._12_4_ = 0;
            fVar266 = *(float *)(pcVar6 + lVar13 + 0x24);
            fVar280 = *(float *)(pcVar6 + lVar13 + 0x28);
            fVar282 = *(float *)(pcVar6 + lVar13 + 0x2c);
            fVar284 = *(float *)(pcVar6 + lVar13 + 0x30);
            fVar105 = fVar284 * fVar284 + fVar282 * fVar282 + fVar266 * fVar266 + fVar280 * fVar280;
            auVar268 = rsqrtss(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105));
            fVar104 = auVar268._0_4_;
            auVar132._4_12_ = auVar268._4_12_;
            fVar104 = fVar104 * fVar104 * fVar105 * -0.5 * fVar104 + fVar104 * 1.5;
            in_XMM8 = insertps(auVar220,ZEXT416((uint)(fVar266 * fVar104)),0x30);
            auVar268 = insertps(auVar202,ZEXT416((uint)(fVar280 * fVar104)),0x30);
            auVar132._0_4_ = fVar104 * fVar284;
            auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
            in_XMM13 = insertps(auVar129,auVar132,0x30);
            auVar107 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
            auVar274 = insertps(auVar107,ZEXT416((uint)(fVar282 * fVar104)),0x30);
          }
          else {
            auVar274 = auVar304;
            if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7->ptr_ofs;
              lVar13 = pRVar7->stride * uVar15;
              auVar268 = *(undefined1 (*) [16])(pcVar6 + lVar13);
              auVar274 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10);
              in_XMM13 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20);
              in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30);
            }
          }
          fVar266 = auVar268._0_4_;
          fVar280 = auVar268._4_4_;
          fVar282 = auVar268._8_4_;
          fVar284 = auVar268._12_4_;
          fVar188 = auVar274._0_4_;
          fVar252 = auVar274._4_4_;
          fVar186 = auVar274._8_4_;
          fVar194 = auVar274._12_4_;
          auVar262._4_4_ = fVar252;
          auVar262._0_4_ = fVar252;
          auVar262._8_4_ = fVar252;
          auVar262._12_4_ = fVar252;
          fVar196 = in_XMM13._0_4_;
          fVar119 = in_XMM13._4_4_;
          fVar123 = in_XMM13._8_4_;
          fVar120 = in_XMM13._12_4_;
          auVar231._4_4_ = fVar119;
          auVar231._0_4_ = fVar119;
          auVar231._8_4_ = fVar119;
          auVar231._12_4_ = fVar119;
          auVar248._4_4_ = fVar123;
          auVar248._0_4_ = fVar123;
          auVar248._8_4_ = fVar123;
          auVar248._12_4_ = fVar123;
          fVar105 = in_XMM8._0_4_;
          fVar118 = in_XMM8._4_4_;
          fVar78 = in_XMM8._8_4_;
          fVar104 = in_XMM8._12_4_;
          auVar204._4_4_ = fVar118;
          auVar204._0_4_ = fVar118;
          auVar204._8_4_ = fVar118;
          auVar204._12_4_ = fVar118;
          RVar3 = pRVar7[1].format;
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
            auVar248 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
            auVar231 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
            auVar204 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
            auVar262 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar248._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
            auVar248._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar248._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
            auVar248._12_4_ = 0;
            auVar231._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
            auVar231._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
            auVar231._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
            auVar231._12_4_ = 0;
            auVar204._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar204._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar204._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar204._12_4_ = 0;
            auVar262._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
            auVar262._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
            auVar262._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
            auVar262._12_4_ = 0;
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar203._8_8_ = 0;
            auVar203._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
            auVar107 = insertps(auVar203,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
            auVar247._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
            auVar247._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar247._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
            auVar247._12_4_ = 0;
            auVar261._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar261._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar261._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar261._12_4_ = 0;
            fVar121 = *(float *)(pcVar6 + lVar13 + 0x24);
            fVar122 = *(float *)(pcVar6 + lVar13 + 0x28);
            fVar124 = *(float *)(pcVar6 + lVar13 + 0x2c);
            fVar125 = *(float *)(pcVar6 + lVar13 + 0x30);
            fVar139 = fVar125 * fVar125 + fVar124 * fVar124 + fVar121 * fVar121 + fVar122 * fVar122;
            auVar268 = rsqrtss(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
            fVar138 = auVar268._0_4_;
            auVar133._4_12_ = auVar268._4_12_;
            fVar138 = fVar138 * fVar138 * fVar139 * -0.5 * fVar138 + fVar138 * 1.5;
            auVar262 = insertps(auVar261,ZEXT416((uint)(fVar121 * fVar138)),0x30);
            auVar248 = insertps(auVar247,ZEXT416((uint)(fVar122 * fVar138)),0x30);
            auVar133._0_4_ = fVar138 * fVar125;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
            auVar204 = insertps(auVar107,auVar133,0x30);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
            auVar231 = insertps(auVar268,ZEXT416((uint)(fVar124 * fVar138)),0x30);
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar248 = *(undefined1 (*) [16])(pcVar6 + lVar13);
            auVar231 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10);
            auVar204 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20);
            auVar262 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30);
          }
          auVar249._12_4_ = auVar248._12_4_;
          auVar249._4_4_ = auVar249._12_4_;
          auVar249._0_4_ = auVar249._12_4_;
          auVar249._8_4_ = auVar249._12_4_;
          auVar263._12_4_ = auVar262._12_4_;
          auVar263._4_4_ = auVar263._12_4_;
          auVar263._0_4_ = auVar263._12_4_;
          auVar263._8_4_ = auVar263._12_4_;
          auVar232._12_4_ = auVar231._12_4_;
          auVar232._4_4_ = auVar232._12_4_;
          auVar232._0_4_ = auVar232._12_4_;
          auVar232._8_4_ = auVar232._12_4_;
          auVar205._12_4_ = auVar204._12_4_;
          auVar205._4_4_ = auVar205._12_4_;
          auVar205._0_4_ = auVar205._12_4_;
          auVar205._8_4_ = auVar205._12_4_;
          auVar110._0_4_ =
               fVar120 * auVar205._12_4_ +
               fVar194 * auVar232._12_4_ + fVar284 * auVar249._12_4_ + fVar104 * auVar263._12_4_;
          auVar110._4_4_ =
               fVar120 * auVar205._12_4_ +
               fVar194 * auVar232._12_4_ + fVar284 * auVar249._12_4_ + fVar104 * auVar263._12_4_;
          auVar110._8_4_ =
               fVar120 * auVar205._12_4_ +
               fVar194 * auVar232._12_4_ + fVar284 * auVar249._12_4_ + fVar104 * auVar263._12_4_;
          auVar110._12_4_ =
               fVar120 * auVar205._12_4_ +
               fVar194 * auVar232._12_4_ + fVar284 * auVar249._12_4_ + fVar104 * auVar263._12_4_;
          uVar15 = CONCAT44(auVar110._4_4_,auVar110._0_4_);
          auVar306._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar306._8_4_ = -auVar110._8_4_;
          auVar306._12_4_ = -auVar110._12_4_;
          auVar19._4_4_ = -(uint)(auVar110._4_4_ < -auVar110._4_4_);
          auVar19._0_4_ = -(uint)(auVar110._0_4_ < -auVar110._0_4_);
          auVar19._8_4_ = -(uint)(auVar110._8_4_ < auVar306._8_4_);
          auVar19._12_4_ = -(uint)(auVar110._12_4_ < auVar306._12_4_);
          uVar15 = CONCAT44(auVar263._12_4_,auVar263._12_4_);
          auVar83._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar83._8_4_ = -auVar263._12_4_;
          auVar83._12_4_ = -auVar263._12_4_;
          auVar260 = blendvps(auVar263,auVar83,auVar19);
          uVar15 = CONCAT44(auVar249._12_4_,auVar249._12_4_);
          auVar84._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar84._8_4_ = -auVar249._12_4_;
          auVar84._12_4_ = -auVar249._12_4_;
          auVar217 = blendvps(auVar249,auVar84,auVar19);
          uVar15 = CONCAT44(auVar232._12_4_,auVar232._12_4_);
          auVar85._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar85._8_4_ = -auVar232._12_4_;
          auVar85._12_4_ = -auVar232._12_4_;
          auVar129 = blendvps(auVar232,auVar85,auVar19);
          uVar15 = CONCAT44(auVar205._12_4_,auVar205._12_4_);
          auVar86._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar86._8_4_ = -auVar205._12_4_;
          auVar86._12_4_ = -auVar205._12_4_;
          auVar107 = blendvps(auVar205,auVar86,auVar19);
          auVar322 = maxps(auVar306,auVar110);
          fVar121 = ABS(auVar110._0_4_);
          fVar122 = ABS(auVar110._4_4_);
          uVar15 = CONCAT44(auVar110._4_4_,auVar110._0_4_);
          auVar111._0_8_ = uVar15 & 0x7fffffff7fffffff;
          auVar111._8_4_ = ABS(auVar110._8_4_);
          auVar111._12_4_ = ABS(auVar110._12_4_);
          auVar87._0_4_ = 1.0 - fVar121;
          auVar87._4_4_ = 1.0 - fVar122;
          auVar87._8_4_ = 1.0 - auVar111._8_4_;
          auVar87._12_4_ = 1.0 - auVar111._12_4_;
          auVar268 = sqrtps(auVar87,auVar87);
          auVar20._0_4_ =
               1.5707964 -
               auVar268._0_4_ *
               (((((fVar121 * -0.0043095737 + 0.0192803) * fVar121 + -0.04489909) * fVar121 +
                 0.08785567) * fVar121 + -0.21450998) * fVar121 + 1.5707952);
          auVar20._4_4_ =
               1.5707964 -
               auVar268._4_4_ *
               (((((fVar122 * -0.0043095737 + 0.0192803) * fVar122 + -0.04489909) * fVar122 +
                 0.08785567) * fVar122 + -0.21450998) * fVar122 + 1.5707952);
          auVar20._8_4_ =
               1.5707964 -
               auVar268._8_4_ *
               (((((auVar111._8_4_ * -0.0043095737 + 0.0192803) * auVar111._8_4_ + -0.04489909) *
                  auVar111._8_4_ + 0.08785567) * auVar111._8_4_ + -0.21450998) * auVar111._8_4_ +
               1.5707952);
          auVar20._12_4_ =
               1.5707964 -
               auVar268._12_4_ *
               (((((auVar111._12_4_ * -0.0043095737 + 0.0192803) * auVar111._12_4_ + -0.04489909) *
                  auVar111._12_4_ + 0.08785567) * auVar111._12_4_ + -0.21450998) * auVar111._12_4_ +
               1.5707952);
          auVar268 = maxps(ZEXT816(0),auVar20);
          fVar310 = auVar322._0_4_;
          fVar314 = auVar322._4_4_;
          fVar317 = auVar322._8_4_;
          fVar286 = auVar322._12_4_;
          auVar21._4_4_ = -(uint)(fVar314 < 0.0);
          auVar21._0_4_ = -(uint)(fVar310 < 0.0);
          auVar21._8_4_ = -(uint)(fVar317 < 0.0);
          auVar21._12_4_ = -(uint)(fVar286 < 0.0);
          auVar147._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar147._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar147._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar268 = blendvps(auVar268,auVar147,auVar21);
          auVar148._0_4_ = 1.5707964 - auVar268._0_4_;
          auVar148._4_4_ = 1.5707964 - auVar268._4_4_;
          auVar148._8_4_ = 1.5707964 - auVar268._8_4_;
          auVar148._12_4_ = 1.5707964 - auVar268._12_4_;
          auVar22._4_4_ = -(uint)(1.0 < fVar122);
          auVar22._0_4_ = -(uint)(1.0 < fVar121);
          auVar22._8_4_ = -(uint)(1.0 < auVar111._8_4_);
          auVar22._12_4_ = -(uint)(1.0 < auVar111._12_4_);
          auVar268 = blendvps(auVar148,_DAT_01f4bc50,auVar22);
          fVar121 = auVar268._0_4_ * auVar304._0_4_;
          fVar122 = auVar268._4_4_ * auVar304._4_4_;
          fVar124 = auVar268._8_4_ * auVar304._8_4_;
          fVar125 = auVar268._12_4_ * auVar304._12_4_;
          auVar23._0_4_ = fVar121 * 0.63661975;
          auVar23._4_4_ = fVar122 * 0.63661975;
          auVar23._8_4_ = fVar124 * 0.63661975;
          auVar23._12_4_ = fVar125 * 0.63661975;
          auVar268 = roundps(auVar111,auVar23,1);
          auVar24._0_8_ = CONCAT44((int)auVar268._4_4_,(int)auVar268._0_4_);
          auVar24._8_4_ = (int)auVar268._8_4_;
          auVar24._12_4_ = (int)auVar268._12_4_;
          fVar121 = fVar121 - auVar268._0_4_ * 1.5707964;
          fVar122 = fVar122 - auVar268._4_4_ * 1.5707964;
          fVar124 = fVar124 - auVar268._8_4_ * 1.5707964;
          fVar125 = fVar125 - auVar268._12_4_ * 1.5707964;
          auVar233._0_8_ = auVar24._0_8_ & 0x300000003;
          auVar233._8_8_ = auVar24._8_8_ & 0x300000003;
          fVar138 = fVar121 * fVar121;
          fVar139 = fVar122 * fVar122;
          fVar140 = fVar124 * fVar124;
          fVar141 = fVar125 * fVar125;
          uVar15 = auVar24._0_8_ & (ulong)DAT_01f46b40;
          uVar40 = auVar24._8_8_ & DAT_01f46b40._8_8_;
          iVar300 = (int)uVar15;
          auVar134._0_4_ = -(uint)(iVar300 == 0);
          iVar309 = (int)(uVar15 >> 0x20);
          auVar134._4_4_ = -(uint)(iVar309 == 0);
          iVar313 = (int)uVar40;
          iVar316 = (int)(uVar40 >> 0x20);
          auVar134._8_4_ = -(uint)(iVar313 == 0);
          auVar134._12_4_ = -(uint)(iVar316 == 0);
          auVar88._4_4_ = -iVar309;
          auVar88._0_4_ = -iVar300;
          auVar88._8_4_ = -iVar313;
          auVar88._12_4_ = -iVar316;
          auVar275._0_8_ =
               CONCAT44((((((fVar139 * -2.5029328e-08 + 2.7600126e-06) * fVar139 + -0.00019842605) *
                           fVar139 + 0.008333348) * fVar139 + -0.16666667) * fVar139 + 1.0) *
                        fVar122,(((((fVar138 * -2.5029328e-08 + 2.7600126e-06) * fVar138 +
                                   -0.00019842605) * fVar138 + 0.008333348) * fVar138 + -0.16666667)
                                 * fVar138 + 1.0) * fVar121);
          auVar275._8_4_ =
               (((((fVar140 * -2.5029328e-08 + 2.7600126e-06) * fVar140 + -0.00019842605) * fVar140
                 + 0.008333348) * fVar140 + -0.16666667) * fVar140 + 1.0) * fVar124;
          auVar275._12_4_ =
               (((((fVar141 * -2.5029328e-08 + 2.7600126e-06) * fVar141 + -0.00019842605) * fVar141
                 + 0.008333348) * fVar141 + -0.16666667) * fVar141 + 1.0) * fVar125;
          auVar206._0_4_ =
               ((((fVar138 * -2.5963018e-07 + 2.4756235e-05) * fVar138 + -0.001388833) * fVar138 +
                0.04166664) * fVar138 + -0.5) * fVar138 + 1.0;
          auVar206._4_4_ =
               ((((fVar139 * -2.5963018e-07 + 2.4756235e-05) * fVar139 + -0.001388833) * fVar139 +
                0.04166664) * fVar139 + -0.5) * fVar139 + 1.0;
          auVar206._8_4_ =
               ((((fVar140 * -2.5963018e-07 + 2.4756235e-05) * fVar140 + -0.001388833) * fVar140 +
                0.04166664) * fVar140 + -0.5) * fVar140 + 1.0;
          auVar206._12_4_ =
               ((((fVar141 * -2.5963018e-07 + 2.4756235e-05) * fVar141 + -0.001388833) * fVar141 +
                0.04166664) * fVar141 + -0.5) * fVar141 + 1.0;
          auVar149._8_4_ = auVar275._8_4_;
          auVar149._0_8_ = auVar275._0_8_;
          auVar149._12_4_ = auVar275._12_4_;
          auVar268 = blendvps(auVar149,auVar206,auVar88);
          auVar322 = blendvps(auVar275,auVar206,auVar134);
          uVar38 = (uint)DAT_01f46b40;
          auVar25._0_4_ = -(uint)((int)uVar38 < (int)auVar233._0_8_);
          iVar300 = (int)(auVar233._0_8_ >> 0x20);
          uVar39 = DAT_01f46b40._4_4_;
          auVar25._4_4_ = -(uint)((int)uVar39 < iVar300);
          uVar42 = DAT_01f46b40._8_4_;
          iVar309 = (int)(auVar233._8_8_ >> 0x20);
          auVar25._8_4_ = -(uint)((int)uVar42 < (int)auVar233._8_8_);
          uVar43 = DAT_01f46b40._12_4_;
          auVar25._12_4_ = -(uint)((int)uVar43 < iVar309);
          auVar89._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar89._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar89._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar268 = blendvps(auVar268,auVar89,auVar25);
          uVar10 = (int)auVar233._0_8_ - 1;
          uVar36 = iVar300 - 1;
          uVar37 = (int)auVar233._8_8_ - 1;
          uVar41 = iVar309 - 1;
          auVar112._0_4_ =
               -(uint)(((uVar10 < uVar38) * uVar10 | (uVar10 >= uVar38) * uVar38) == uVar10);
          auVar112._4_4_ =
               -(uint)(((uVar36 < uVar39) * uVar36 | (uVar36 >= uVar39) * uVar39) == uVar36);
          auVar112._8_4_ =
               -(uint)(((uVar37 < uVar42) * uVar37 | (uVar37 >= uVar42) * uVar42) == uVar37);
          auVar112._12_4_ =
               -(uint)(((uVar41 < uVar43) * uVar41 | (uVar41 >= uVar43) * uVar43) == uVar41);
          auVar190._0_8_ = auVar322._0_8_ ^ 0x8000000080000000;
          auVar190._8_4_ = auVar322._8_4_ ^ 0x80000000;
          auVar190._12_4_ = auVar322._12_4_ ^ 0x80000000;
          auVar322 = blendvps(auVar322,auVar190,auVar112);
          fVar121 = fVar104 * fVar310 - auVar260._0_4_;
          fVar122 = fVar104 * fVar314 - auVar260._4_4_;
          fVar124 = fVar104 * fVar317 - auVar260._8_4_;
          fVar125 = fVar104 * fVar286 - auVar260._12_4_;
          local_98._0_4_ = auVar217._0_4_;
          local_98._4_4_ = auVar217._4_4_;
          fStack_90 = auVar217._8_4_;
          fStack_8c = auVar217._12_4_;
          fVar141 = fVar284 * fVar310 - (float)local_98._0_4_;
          fVar142 = fVar284 * fVar314 - (float)local_98._4_4_;
          fVar143 = fVar284 * fVar317 - fStack_90;
          fVar144 = fVar284 * fVar286 - fStack_8c;
          fVar184 = fVar194 * fVar310 - auVar129._0_4_;
          fVar185 = fVar194 * fVar314 - auVar129._4_4_;
          fVar187 = fVar194 * fVar317 - auVar129._8_4_;
          fVar193 = fVar194 * fVar286 - auVar129._12_4_;
          local_2a8._0_4_ = auVar107._0_4_;
          local_2a8._4_4_ = auVar107._4_4_;
          uStack_2a0._0_4_ = auVar107._8_4_;
          uStack_2a0._4_4_ = auVar107._12_4_;
          fVar237 = fVar120 * fVar310 - (float)local_2a8._0_4_;
          fVar238 = fVar120 * fVar314 - (float)local_2a8._4_4_;
          fVar239 = fVar120 * fVar317 - (float)uStack_2a0;
          fVar240 = fVar120 * fVar286 - uStack_2a0._4_4_;
          auVar90._0_4_ =
               fVar237 * fVar237 + fVar184 * fVar184 + fVar141 * fVar141 + fVar121 * fVar121;
          auVar90._4_4_ =
               fVar238 * fVar238 + fVar185 * fVar185 + fVar142 * fVar142 + fVar122 * fVar122;
          auVar90._8_4_ =
               fVar239 * fVar239 + fVar187 * fVar187 + fVar143 * fVar143 + fVar124 * fVar124;
          auVar90._12_4_ =
               fVar240 * fVar240 + fVar193 * fVar193 + fVar144 * fVar144 + fVar125 * fVar125;
          auVar107 = rsqrtps(auVar233,auVar90);
          fVar138 = auVar107._0_4_;
          fVar139 = auVar107._4_4_;
          fVar140 = auVar107._8_4_;
          fVar195 = auVar107._12_4_;
          fVar319 = fVar138 * 1.5 - fVar138 * fVar138 * auVar90._0_4_ * 0.5 * fVar138;
          fVar326 = fVar139 * 1.5 - fVar139 * fVar139 * auVar90._4_4_ * 0.5 * fVar139;
          fVar328 = fVar140 * 1.5 - fVar140 * fVar140 * auVar90._8_4_ * 0.5 * fVar140;
          fVar330 = fVar195 * 1.5 - fVar195 * fVar195 * auVar90._12_4_ * 0.5 * fVar195;
          fVar195 = auVar268._0_4_;
          fVar198 = auVar268._4_4_;
          fVar212 = auVar268._8_4_;
          fVar226 = auVar268._12_4_;
          fVar294 = auVar322._0_4_;
          fVar295 = auVar322._4_4_;
          fVar297 = auVar322._8_4_;
          fVar301 = auVar322._12_4_;
          local_278._4_4_ = fVar104 * fVar295 - fVar122 * fVar326 * fVar198;
          local_278._0_4_ = fVar104 * fVar294 - fVar121 * fVar319 * fVar195;
          fStack_270 = fVar104 * fVar297 - fVar124 * fVar328 * fVar212;
          fStack_26c = fVar104 * fVar301 - fVar125 * fVar330 * fVar226;
          fVar138 = (auVar260._0_4_ - fVar104) * auVar304._0_4_ + fVar104;
          fVar139 = (auVar260._4_4_ - fVar104) * auVar304._4_4_ + fVar104;
          fVar140 = (auVar260._8_4_ - fVar104) * auVar304._8_4_ + fVar104;
          fVar104 = (auVar260._12_4_ - fVar104) * auVar304._12_4_ + fVar104;
          fVar121 = ((float)local_98._0_4_ - fVar284) * auVar304._0_4_ + fVar284;
          fVar122 = ((float)local_98._4_4_ - fVar284) * auVar304._4_4_ + fVar284;
          fVar124 = (fStack_90 - fVar284) * auVar304._8_4_ + fVar284;
          fVar125 = (fStack_8c - fVar284) * auVar304._12_4_ + fVar284;
          fVar197 = (auVar129._0_4_ - fVar194) * auVar304._0_4_ + fVar194;
          fVar211 = (auVar129._4_4_ - fVar194) * auVar304._4_4_ + fVar194;
          fVar213 = (auVar129._8_4_ - fVar194) * auVar304._8_4_ + fVar194;
          fVar227 = (auVar129._12_4_ - fVar194) * auVar304._12_4_ + fVar194;
          auVar207._0_4_ = fVar197 * fVar197 + fVar121 * fVar121 + fVar138 * fVar138;
          auVar207._4_4_ = fVar211 * fVar211 + fVar122 * fVar122 + fVar139 * fVar139;
          auVar207._8_4_ = fVar213 * fVar213 + fVar124 * fVar124 + fVar140 * fVar140;
          auVar207._12_4_ = fVar227 * fVar227 + fVar125 * fVar125 + fVar104 * fVar104;
          fVar253 = ((float)local_2a8._0_4_ - fVar120) * auVar304._0_4_ + fVar120;
          fVar254 = ((float)local_2a8._4_4_ - fVar120) * auVar304._4_4_ + fVar120;
          fVar311 = ((float)uStack_2a0 - fVar120) * auVar304._8_4_ + fVar120;
          fVar285 = (uStack_2a0._4_4_ - fVar120) * auVar304._12_4_ + fVar120;
          auVar221._0_4_ = fVar253 * fVar253 + auVar207._0_4_;
          auVar221._4_4_ = fVar254 * fVar254 + auVar207._4_4_;
          auVar221._8_4_ = fVar311 * fVar311 + auVar207._8_4_;
          auVar221._12_4_ = fVar285 * fVar285 + auVar207._12_4_;
          auVar268 = rsqrtps(auVar207,auVar221);
          fVar241 = auVar268._0_4_;
          fVar242 = auVar268._4_4_;
          fVar243 = auVar268._8_4_;
          fVar251 = auVar268._12_4_;
          fVar241 = fVar241 * 1.5 - fVar241 * fVar241 * auVar221._0_4_ * 0.5 * fVar241;
          fVar242 = fVar242 * 1.5 - fVar242 * fVar242 * auVar221._4_4_ * 0.5 * fVar242;
          fVar243 = fVar243 * 1.5 - fVar243 * fVar243 * auVar221._8_4_ * 0.5 * fVar243;
          fVar251 = fVar251 * 1.5 - fVar251 * fVar251 * auVar221._12_4_ * 0.5 * fVar251;
          auVar91._0_4_ = fVar138 * fVar241;
          auVar91._4_4_ = fVar139 * fVar242;
          auVar91._8_4_ = fVar140 * fVar243;
          auVar91._12_4_ = fVar104 * fVar251;
          auVar26._4_4_ = -(uint)(0.9995 < fVar314);
          auVar26._0_4_ = -(uint)(0.9995 < fVar310);
          auVar26._8_4_ = -(uint)(0.9995 < fVar317);
          auVar26._12_4_ = -(uint)(0.9995 < fVar286);
          auVar268 = blendvps(_local_278,auVar91,auVar26);
          auVar208._0_4_ = fVar284 * fVar294 - fVar141 * fVar319 * fVar195;
          auVar208._4_4_ = fVar284 * fVar295 - fVar142 * fVar326 * fVar198;
          auVar208._8_4_ = fVar284 * fVar297 - fVar143 * fVar328 * fVar212;
          auVar208._12_4_ = fVar284 * fVar301 - fVar144 * fVar330 * fVar226;
          auVar72._0_4_ = fVar121 * fVar241;
          auVar72._4_4_ = fVar122 * fVar242;
          auVar72._8_4_ = fVar124 * fVar243;
          auVar72._12_4_ = fVar125 * fVar251;
          auVar107 = blendvps(auVar208,auVar72,auVar26);
          auVar222._0_4_ = fVar194 * fVar294 - fVar184 * fVar319 * fVar195;
          auVar222._4_4_ = fVar194 * fVar295 - fVar185 * fVar326 * fVar198;
          auVar222._8_4_ = fVar194 * fVar297 - fVar187 * fVar328 * fVar212;
          auVar222._12_4_ = fVar194 * fVar301 - fVar193 * fVar330 * fVar226;
          auVar150._0_4_ = fVar197 * fVar241;
          auVar150._4_4_ = fVar211 * fVar242;
          auVar150._8_4_ = fVar213 * fVar243;
          auVar150._12_4_ = fVar227 * fVar251;
          auVar129 = blendvps(auVar222,auVar150,auVar26);
          auVar276._0_4_ = fVar294 * fVar120 - fVar319 * fVar237 * fVar195;
          auVar276._4_4_ = fVar295 * fVar120 - fVar326 * fVar238 * fVar198;
          auVar276._8_4_ = fVar297 * fVar120 - fVar328 * fVar239 * fVar212;
          auVar276._12_4_ = fVar301 * fVar120 - fVar330 * fVar240 * fVar226;
          auVar264._0_4_ = fVar241 * fVar253;
          auVar264._4_4_ = fVar242 * fVar254;
          auVar264._8_4_ = fVar243 * fVar311;
          auVar264._12_4_ = fVar251 * fVar285;
          auVar217 = blendvps(auVar276,auVar264,auVar26);
          local_108._0_4_ = auVar248._0_4_;
          fVar284 = 1.0 - auVar304._0_4_;
          fVar104 = 1.0 - auVar304._4_4_;
          fVar194 = 1.0 - auVar304._8_4_;
          fVar120 = 1.0 - auVar304._12_4_;
          local_288._4_4_ = fVar266 * fVar104 + (float)local_108._0_4_ * auVar304._4_4_;
          local_288._0_4_ = fVar266 * fVar284 + (float)local_108._0_4_ * auVar304._0_4_;
          fStack_280 = fVar266 * fVar194 + (float)local_108._0_4_ * auVar304._8_4_;
          fStack_27c = fVar266 * fVar120 + (float)local_108._0_4_ * auVar304._12_4_;
          local_178._4_4_ = auVar248._4_4_;
          local_258._4_4_ = fVar280 * fVar104 + (float)local_178._4_4_ * auVar304._4_4_;
          local_258._0_4_ = fVar280 * fVar284 + (float)local_178._4_4_ * auVar304._0_4_;
          uStack_250._0_4_ = fVar280 * fVar194 + (float)local_178._4_4_ * auVar304._8_4_;
          uStack_250._4_4_ = fVar280 * fVar120 + (float)local_178._4_4_ * auVar304._12_4_;
          fStack_140 = auVar248._8_4_;
          local_248._4_4_ = fVar282 * fVar104 + fStack_140 * auVar304._4_4_;
          local_248._0_4_ = fVar282 * fVar284 + fStack_140 * auVar304._0_4_;
          uStack_240._0_4_ = fVar282 * fVar194 + fStack_140 * auVar304._8_4_;
          uStack_240._4_4_ = fVar282 * fVar120 + fStack_140 * auVar304._12_4_;
          local_88._0_4_ = auVar231._0_4_;
          local_238._4_4_ = fVar188 * fVar104 + (float)local_88._0_4_ * auVar304._4_4_;
          local_238._0_4_ = fVar188 * fVar284 + (float)local_88._0_4_ * auVar304._0_4_;
          uStack_230._0_4_ = fVar188 * fVar194 + (float)local_88._0_4_ * auVar304._8_4_;
          uStack_230._4_4_ = fVar188 * fVar120 + (float)local_88._0_4_ * auVar304._12_4_;
          local_78._4_4_ = auVar231._4_4_;
          local_1d8._4_4_ = fVar252 * fVar104 + (float)local_78._4_4_ * auVar304._4_4_;
          local_1d8._0_4_ = fVar252 * fVar284 + (float)local_78._4_4_ * auVar304._0_4_;
          fStack_1d0 = fVar252 * fVar194 + (float)local_78._4_4_ * auVar304._8_4_;
          fStack_1cc = fVar252 * fVar120 + (float)local_78._4_4_ * auVar304._12_4_;
          fStack_f0 = auVar231._8_4_;
          local_268._4_4_ = fVar186 * fVar104 + fStack_f0 * auVar304._4_4_;
          local_268._0_4_ = fVar186 * fVar284 + fStack_f0 * auVar304._0_4_;
          uStack_260._0_4_ = fVar186 * fVar194 + fStack_f0 * auVar304._8_4_;
          uStack_260._4_4_ = fVar186 * fVar120 + fStack_f0 * auVar304._12_4_;
          local_188._0_4_ = auVar204._0_4_;
          local_298._4_4_ = fVar196 * fVar104 + (float)local_188._0_4_ * auVar304._4_4_;
          local_298._0_4_ = fVar196 * fVar284 + (float)local_188._0_4_ * auVar304._0_4_;
          fStack_290 = fVar196 * fVar194 + (float)local_188._0_4_ * auVar304._8_4_;
          fStack_28c = fVar196 * fVar120 + (float)local_188._0_4_ * auVar304._12_4_;
          local_158._4_4_ = auVar204._4_4_;
          fStack_e0 = auVar204._8_4_;
          local_198._0_4_ = auVar262._0_4_;
          local_168._4_4_ = auVar262._4_4_;
          fStack_130 = auVar262._8_4_;
          local_1b8._4_4_ = fVar119 * fVar104 + (float)local_158._4_4_ * auVar304._4_4_;
          local_1b8._0_4_ = fVar119 * fVar284 + (float)local_158._4_4_ * auVar304._0_4_;
          fStack_1b0 = fVar119 * fVar194 + (float)local_158._4_4_ * auVar304._8_4_;
          fStack_1ac = fVar119 * fVar120 + (float)local_158._4_4_ * auVar304._12_4_;
          local_1c8._4_4_ = fVar123 * fVar104 + fStack_e0 * auVar304._4_4_;
          local_1c8._0_4_ = fVar123 * fVar284 + fStack_e0 * auVar304._0_4_;
          fStack_1c0 = fVar123 * fVar194 + fStack_e0 * auVar304._8_4_;
          fStack_1bc = fVar123 * fVar120 + fStack_e0 * auVar304._12_4_;
          local_1f8._4_4_ = fVar105 * fVar104 + (float)local_198._0_4_ * auVar304._4_4_;
          local_1f8._0_4_ = fVar105 * fVar284 + (float)local_198._0_4_ * auVar304._0_4_;
          uStack_1f0._0_4_ = fVar105 * fVar194 + (float)local_198._0_4_ * auVar304._8_4_;
          uStack_1f0._4_4_ = fVar105 * fVar120 + (float)local_198._0_4_ * auVar304._12_4_;
          local_1a8._4_4_ = fVar118 * fVar104 + (float)local_168._4_4_ * auVar304._4_4_;
          local_1a8._0_4_ = fVar118 * fVar284 + (float)local_168._4_4_ * auVar304._0_4_;
          fStack_1a0 = fVar118 * fVar194 + (float)local_168._4_4_ * auVar304._8_4_;
          fStack_19c = fVar118 * fVar120 + (float)local_168._4_4_ * auVar304._12_4_;
          local_208._4_4_ = fVar104 * fVar78 + fStack_130 * auVar304._4_4_;
          local_208._0_4_ = fVar284 * fVar78 + fStack_130 * auVar304._0_4_;
          fStack_200 = fVar194 * fVar78 + fStack_130 * auVar304._8_4_;
          fStack_1fc = fVar120 * fVar78 + fStack_130 * auVar304._12_4_;
          fVar196 = auVar107._0_4_;
          fVar119 = auVar107._4_4_;
          fVar120 = auVar107._12_4_;
          local_278._0_4_ = auVar268._0_4_;
          local_278._4_4_ = auVar268._4_4_;
          fStack_270 = auVar268._8_4_;
          fStack_26c = auVar268._12_4_;
          fVar123 = auVar107._8_4_;
          fVar139 = auVar129._0_4_;
          fVar141 = auVar129._4_4_;
          fVar143 = auVar129._8_4_;
          fVar184 = auVar129._12_4_;
          fVar104 = auVar217._0_4_;
          fVar118 = auVar217._4_4_;
          fVar188 = auVar217._8_4_;
          fVar186 = auVar217._12_4_;
          fVar266 = fVar196 * fVar139 + (float)local_278._0_4_ * fVar104;
          fVar280 = fVar119 * fVar141 + (float)local_278._4_4_ * fVar118;
          fVar282 = fVar123 * fVar143 + fStack_270 * fVar188;
          fVar284 = fVar120 * fVar184 + fStack_26c * fVar186;
          fVar238 = fVar196 * fVar139 - (float)local_278._0_4_ * fVar104;
          fVar239 = fVar119 * fVar141 - (float)local_278._4_4_ * fVar118;
          fVar240 = fVar123 * fVar143 - fStack_270 * fVar188;
          fVar241 = fVar120 * fVar184 - fStack_26c * fVar186;
          fVar197 = fVar139 * fVar139;
          fVar198 = fVar141 * fVar141;
          fVar211 = fVar143 * fVar143;
          fVar212 = fVar184 * fVar184;
          fVar105 = (float)local_278._0_4_ * (float)local_278._0_4_ - fVar196 * fVar196;
          fVar78 = (float)local_278._4_4_ * (float)local_278._4_4_ - fVar119 * fVar119;
          fVar252 = fStack_270 * fStack_270 - fVar123 * fVar123;
          fVar194 = fStack_26c * fStack_26c - fVar120 * fVar120;
          fVar138 = fVar196 * fVar104 - (float)local_278._0_4_ * fVar139;
          fVar140 = fVar119 * fVar118 - (float)local_278._4_4_ * fVar141;
          fVar142 = fVar123 * fVar188 - fStack_270 * fVar143;
          fVar144 = fVar120 * fVar186 - fStack_26c * fVar184;
          fVar121 = (float)local_278._0_4_ * fVar139 + fVar196 * fVar104;
          fVar122 = (float)local_278._4_4_ * fVar141 + fVar119 * fVar118;
          fVar124 = fStack_270 * fVar143 + fVar123 * fVar188;
          fVar125 = fStack_26c * fVar184 + fVar120 * fVar186;
          fVar185 = fVar104 * fVar139 + fVar196 * (float)local_278._0_4_;
          fVar187 = fVar118 * fVar141 + fVar119 * (float)local_278._4_4_;
          fVar193 = fVar188 * fVar143 + fVar123 * fStack_270;
          fVar195 = fVar186 * fVar184 + fVar120 * fStack_26c;
          fVar139 = fVar104 * fVar139 - fVar196 * (float)local_278._0_4_;
          fVar141 = fVar118 * fVar141 - fVar119 * (float)local_278._4_4_;
          fVar143 = fVar188 * fVar143 - fVar123 * fStack_270;
          fVar184 = fVar186 * fVar184 - fVar120 * fStack_26c;
          fVar104 = fVar104 * fVar104;
          fVar118 = fVar118 * fVar118;
          fVar188 = fVar188 * fVar188;
          fVar186 = fVar186 * fVar186;
          fVar213 = (((float)local_278._0_4_ * (float)local_278._0_4_ + fVar196 * fVar196) - fVar197
                    ) - fVar104;
          fVar226 = (((float)local_278._4_4_ * (float)local_278._4_4_ + fVar119 * fVar119) - fVar198
                    ) - fVar118;
          fVar227 = ((fStack_270 * fStack_270 + fVar123 * fVar123) - fVar211) - fVar188;
          fVar237 = ((fStack_26c * fStack_26c + fVar120 * fVar120) - fVar212) - fVar186;
          fVar196 = (fVar197 + fVar105) - fVar104;
          fVar119 = (fVar198 + fVar78) - fVar118;
          fVar123 = (fVar211 + fVar252) - fVar188;
          fVar120 = (fVar212 + fVar194) - fVar186;
          fVar104 = (fVar105 - fVar197) + fVar104;
          fVar118 = (fVar78 - fVar198) + fVar118;
          fVar188 = (fVar252 - fVar211) + fVar188;
          fVar186 = (fVar194 - fVar212) + fVar186;
        }
        else {
          while (uVar10 = movmskps((int)pRVar11,_local_2a8), uVar10 != 0) {
            lVar13 = 0;
            if ((uVar10 & 0xff) != 0) {
              for (; ((uVar10 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            iVar12 = *(int *)((long)&local_68 + (long)(int)lVar13 * 4);
            auVar28._0_4_ = -(uint)(iVar12 == iVar300);
            auVar28._4_4_ = -(uint)(iVar12 == iVar309);
            auVar28._8_4_ = -(uint)(iVar12 == iVar313);
            auVar28._12_4_ = -(uint)(iVar12 == iVar316);
            auVar28 = auVar28 & _local_2a8;
            pRVar7 = (this->l2w_buf).items;
            pRVar11 = pRVar7 + iVar12;
            RVar3 = pRVar7[iVar12].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
              auVar322 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
              auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
              in_XMM4 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
              auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
              local_d8 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
              auVar107 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
              in_XMM8 = insertps(auVar107,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar322._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
              auVar322._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
              auVar322._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
              auVar322._12_4_ = 0;
              in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
              in_XMM4._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
              in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
              in_XMM4._12_4_ = 0;
              local_d8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
              local_d8._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
              local_d8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
              local_d8._12_4_ = 0;
              in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
              in_XMM8._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
              in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
              in_XMM8._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
              auVar107 = insertps(auVar73,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
              auVar277._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
              auVar277._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
              auVar277._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
              auVar277._12_4_ = 0;
              auVar224._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
              auVar224._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
              auVar224._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
              auVar224._12_4_ = 0;
              fVar266 = *(float *)(pcVar6 + lVar13 + 0x24);
              fVar280 = *(float *)(pcVar6 + lVar13 + 0x28);
              fVar282 = *(float *)(pcVar6 + lVar13 + 0x2c);
              fVar284 = *(float *)(pcVar6 + lVar13 + 0x30);
              fVar105 = fVar284 * fVar284 +
                        fVar282 * fVar282 + fVar266 * fVar266 + fVar280 * fVar280;
              auVar129 = rsqrtss(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105));
              fVar104 = auVar129._0_4_;
              fVar104 = fVar104 * fVar104 * fVar105 * -0.5 * fVar104 + fVar104 * 1.5;
              in_XMM8 = insertps(auVar224,ZEXT416((uint)(fVar266 * fVar104)),0x30);
              auVar322 = insertps(auVar277,ZEXT416((uint)(fVar280 * fVar104)),0x30);
              auVar291._0_4_ = fVar104 * fVar284;
              auVar291._4_12_ = auVar129._4_12_;
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
              local_d8 = insertps(auVar107,auVar291,0x30);
              auVar107 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
              in_XMM4 = insertps(auVar107,ZEXT416((uint)(fVar282 * fVar104)),0x30);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar322 = *(undefined1 (*) [16])(pcVar6 + lVar13);
              in_XMM4 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10);
              local_d8 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20);
              in_XMM8 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30);
            }
            uVar79 = auVar322._0_4_;
            uVar101 = auVar322._4_4_;
            uVar102 = auVar322._8_4_;
            uVar103 = auVar322._12_4_;
            auVar152._4_4_ = uVar79;
            auVar152._0_4_ = uVar79;
            auVar152._8_4_ = uVar79;
            auVar152._12_4_ = uVar79;
            _local_288 = blendvps(_local_288,auVar152,auVar28);
            auVar153._4_4_ = uVar101;
            auVar153._0_4_ = uVar101;
            auVar153._8_4_ = uVar101;
            auVar153._12_4_ = uVar101;
            _local_258 = blendvps(_local_258,auVar153,auVar28);
            auVar154._4_4_ = uVar102;
            auVar154._0_4_ = uVar102;
            auVar154._8_4_ = uVar102;
            auVar154._12_4_ = uVar102;
            _local_248 = blendvps(_local_248,auVar154,auVar28);
            auVar155._4_4_ = uVar103;
            auVar155._0_4_ = uVar103;
            auVar155._8_4_ = uVar103;
            auVar155._12_4_ = uVar103;
            _local_228 = blendvps(_local_228,auVar155,auVar28);
            uVar79 = in_XMM4._0_4_;
            uVar101 = in_XMM4._4_4_;
            uVar102 = in_XMM4._8_4_;
            uVar103 = in_XMM4._12_4_;
            auVar156._4_4_ = uVar79;
            auVar156._0_4_ = uVar79;
            auVar156._8_4_ = uVar79;
            auVar156._12_4_ = uVar79;
            _local_238 = blendvps(_local_238,auVar156,auVar28);
            auVar157._4_4_ = uVar101;
            auVar157._0_4_ = uVar101;
            auVar157._8_4_ = uVar101;
            auVar157._12_4_ = uVar101;
            _local_1d8 = blendvps(_local_1d8,auVar157,auVar28);
            auVar158._4_4_ = uVar102;
            auVar158._0_4_ = uVar102;
            auVar158._8_4_ = uVar102;
            auVar158._12_4_ = uVar102;
            _local_268 = blendvps(_local_268,auVar158,auVar28);
            auVar159._4_4_ = uVar103;
            auVar159._0_4_ = uVar103;
            auVar159._8_4_ = uVar103;
            auVar159._12_4_ = uVar103;
            _local_1e8 = blendvps(_local_1e8,auVar159,auVar28);
            auVar160._4_4_ = local_d8._0_4_;
            auVar160._0_4_ = local_d8._0_4_;
            auVar160._8_4_ = local_d8._0_4_;
            auVar160._12_4_ = local_d8._0_4_;
            _local_298 = blendvps(_local_298,auVar160,auVar28);
            auVar161._4_4_ = local_d8._4_4_;
            auVar161._0_4_ = local_d8._4_4_;
            auVar161._8_4_ = local_d8._4_4_;
            auVar161._12_4_ = local_d8._4_4_;
            _local_1b8 = blendvps(_local_1b8,auVar161,auVar28);
            auVar162._4_4_ = local_d8._8_4_;
            auVar162._0_4_ = local_d8._8_4_;
            auVar162._8_4_ = local_d8._8_4_;
            auVar162._12_4_ = local_d8._8_4_;
            _local_1c8 = blendvps(_local_1c8,auVar162,auVar28);
            auVar163._4_4_ = local_d8._12_4_;
            auVar163._0_4_ = local_d8._12_4_;
            auVar163._8_4_ = local_d8._12_4_;
            auVar163._12_4_ = local_d8._12_4_;
            _local_218 = blendvps(_local_218,auVar163,auVar28);
            uVar79 = in_XMM8._0_4_;
            uVar101 = in_XMM8._4_4_;
            uVar102 = in_XMM8._8_4_;
            uVar103 = in_XMM8._12_4_;
            auVar164._4_4_ = uVar79;
            auVar164._0_4_ = uVar79;
            auVar164._8_4_ = uVar79;
            auVar164._12_4_ = uVar79;
            _local_1f8 = blendvps(_local_1f8,auVar164,auVar28);
            auVar165._4_4_ = uVar101;
            auVar165._0_4_ = uVar101;
            auVar165._8_4_ = uVar101;
            auVar165._12_4_ = uVar101;
            _local_1a8 = blendvps(_local_1a8,auVar165,auVar28);
            auVar166._4_4_ = uVar102;
            auVar166._0_4_ = uVar102;
            auVar166._8_4_ = uVar102;
            auVar166._12_4_ = uVar102;
            _local_188 = blendvps(_local_188,auVar166,auVar28);
            auVar167._4_4_ = uVar103;
            auVar167._0_4_ = uVar103;
            auVar167._8_4_ = uVar103;
            auVar167._12_4_ = uVar103;
            _local_168 = blendvps(_local_168,auVar167,auVar28);
            RVar3 = pRVar11[1].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              auVar268 = insertps(ZEXT416(*(uint *)((long)&pRVar11->ptr_ofs + (long)pcVar6)),
                                  *(undefined4 *)((long)&pRVar11->stride + (long)pcVar6),0x1c);
              in_XMM11 = insertps(auVar268,*(undefined4 *)((long)&pRVar11->format + (long)pcVar6),
                                  0x28);
              auVar268 = insertps(ZEXT416(*(uint *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->stride + (long)(pcVar6 + 4)),0x1c)
              ;
              in_XMM14 = insertps(auVar268,*(undefined4 *)
                                            ((long)&pRVar11->modCounter + (long)pcVar6),0x28);
              auVar268 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)pcVar6)),
                                  *(undefined4 *)((long)&pRVar11->num + (long)pcVar6),0x1c);
              local_c8 = insertps(auVar268,*(undefined4 *)(&pRVar11->modified + (long)pcVar6),0x28);
              auVar268 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->num + (long)(pcVar6 + 4)),0x1c);
              auVar268 = insertps(auVar268,*(undefined4 *)((long)&pRVar11->userData + (long)pcVar6),
                                  0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              uVar2 = *(undefined8 *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4));
              in_XMM11._4_4_ = (int)uVar2;
              in_XMM11._0_4_ = *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)pcVar6);
              in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM11._12_4_ = 0;
              uVar2 = *(undefined8 *)((long)&pRVar11->stride + (long)pcVar6);
              in_XMM14._4_4_ = (int)uVar2;
              in_XMM14._0_4_ = *(undefined4 *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4));
              in_XMM14._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM14._12_4_ = 0;
              uVar2 = *(undefined8 *)((long)&pRVar11->num + (long)(pcVar6 + 4));
              local_c8._4_4_ = (int)uVar2;
              local_c8._0_4_ = *(undefined4 *)((long)&pRVar11->num + (long)pcVar6);
              local_c8._8_4_ = (int)((ulong)uVar2 >> 0x20);
              local_c8._12_4_ = 0;
              auVar268._4_4_ = (int)*(undefined8 *)(&pRVar11->modified + (long)pcVar6);
              auVar268._0_4_ = (float)*(undefined4 *)((long)&pRVar11->modCounter + (long)pcVar6);
              auVar268._8_4_ =
                   (int)((ulong)*(undefined8 *)(&pRVar11->modified + (long)pcVar6) >> 0x20);
              auVar268._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = *(ulong *)((long)&pRVar11->stride + (long)pcVar6);
              auVar107 = insertps(auVar74,*(undefined4 *)((long)&pRVar11->dptr_ofs + (long)pcVar6),
                                  0x20);
              auVar265._4_4_ = (int)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar11->buffer).ptr);
              auVar265._0_4_ = *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)pcVar6);
              auVar265._8_4_ =
                   (int)((ulong)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar11->buffer).ptr) >> 0x20);
              auVar265._12_4_ = 0;
              uVar2 = *(undefined8 *)((long)&pRVar11->num + (long)(pcVar6 + 4));
              auVar92._4_4_ = (int)uVar2;
              auVar92._0_4_ = *(undefined4 *)((long)&pRVar11->num + (long)pcVar6);
              auVar92._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar92._12_4_ = 0;
              fVar266 = *(float *)((long)&pRVar11->modCounter + (long)pcVar6);
              fVar280 = *(float *)(&pRVar11->modified + (long)pcVar6);
              fVar282 = *(float *)((long)&pRVar11->userData + (long)pcVar6);
              fVar284 = *(float *)(pcVar6 + (long)&(pRVar11->buffer).ptr);
              fVar105 = fVar284 * fVar284 +
                        fVar282 * fVar282 + fVar266 * fVar266 + fVar280 * fVar280;
              auVar129 = rsqrtss(ZEXT416((uint)fVar105),ZEXT416((uint)fVar105));
              fVar104 = auVar129._0_4_;
              fVar104 = fVar104 * fVar104 * fVar105 * -0.5 * fVar104 + fVar104 * 1.5;
              auVar268 = insertps(auVar92,ZEXT416((uint)(fVar266 * fVar104)),0x30);
              in_XMM11 = insertps(auVar265,ZEXT416((uint)(fVar280 * fVar104)),0x30);
              auVar292._0_4_ = fVar104 * fVar284;
              auVar292._4_12_ = auVar129._4_12_;
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4)),0x10
                                 );
              local_c8 = insertps(auVar107,auVar292,0x30);
              auVar107 = insertps(auVar129,*(undefined4 *)
                                            ((long)&pRVar11[1].ptr_ofs + (long)(pcVar6 + 4)),0x20);
              in_XMM14 = insertps(auVar107,ZEXT416((uint)(fVar282 * fVar104)),0x30);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              in_XMM11 = *(undefined1 (*) [16])((long)&pRVar11->ptr_ofs + (long)pcVar6);
              in_XMM14 = *(undefined1 (*) [16])((long)&pRVar11->stride + (long)pcVar6);
              local_c8 = *(undefined1 (*) [16])((long)&pRVar11->format + (long)pcVar6);
              auVar268 = *(undefined1 (*) [16])(pcVar6 + (long)&(pRVar11->buffer).ptr);
            }
            uVar79 = in_XMM11._0_4_;
            uVar101 = in_XMM11._4_4_;
            uVar102 = in_XMM11._8_4_;
            uVar103 = in_XMM11._12_4_;
            auVar168._4_4_ = uVar79;
            auVar168._0_4_ = uVar79;
            auVar168._8_4_ = uVar79;
            auVar168._12_4_ = uVar79;
            _local_b8 = blendvps(_local_b8,auVar168,auVar28);
            auVar169._4_4_ = uVar101;
            auVar169._0_4_ = uVar101;
            auVar169._8_4_ = uVar101;
            auVar169._12_4_ = uVar101;
            _local_a8 = blendvps(_local_a8,auVar169,auVar28);
            auVar170._4_4_ = uVar102;
            auVar170._0_4_ = uVar102;
            auVar170._8_4_ = uVar102;
            auVar170._12_4_ = uVar102;
            _local_98 = blendvps(_local_98,auVar170,auVar28);
            auVar171._4_4_ = uVar103;
            auVar171._0_4_ = uVar103;
            auVar171._8_4_ = uVar103;
            auVar171._12_4_ = uVar103;
            _local_198 = blendvps(_local_198,auVar171,auVar28);
            uVar79 = in_XMM14._0_4_;
            uVar101 = in_XMM14._4_4_;
            uVar102 = in_XMM14._8_4_;
            uVar103 = in_XMM14._12_4_;
            auVar172._4_4_ = uVar79;
            auVar172._0_4_ = uVar79;
            auVar172._8_4_ = uVar79;
            auVar172._12_4_ = uVar79;
            _local_88 = blendvps(_local_88,auVar172,auVar28);
            auVar173._4_4_ = uVar101;
            auVar173._0_4_ = uVar101;
            auVar173._8_4_ = uVar101;
            auVar173._12_4_ = uVar101;
            _local_78 = blendvps(_local_78,auVar173,auVar28);
            auVar174._4_4_ = uVar102;
            auVar174._0_4_ = uVar102;
            auVar174._8_4_ = uVar102;
            auVar174._12_4_ = uVar102;
            _local_108 = blendvps(_local_108,auVar174,auVar28);
            auVar175._4_4_ = uVar103;
            auVar175._0_4_ = uVar103;
            auVar175._8_4_ = uVar103;
            auVar175._12_4_ = uVar103;
            _local_208 = blendvps(_local_208,auVar175,auVar28);
            auVar176._4_4_ = local_c8._0_4_;
            auVar176._0_4_ = local_c8._0_4_;
            auVar176._8_4_ = local_c8._0_4_;
            auVar176._12_4_ = local_c8._0_4_;
            _local_f8 = blendvps(_local_f8,auVar176,auVar28);
            auVar177._4_4_ = local_c8._4_4_;
            auVar177._0_4_ = local_c8._4_4_;
            auVar177._8_4_ = local_c8._4_4_;
            auVar177._12_4_ = local_c8._4_4_;
            _local_178 = blendvps(_local_178,auVar177,auVar28);
            auVar178._4_4_ = local_c8._8_4_;
            auVar178._0_4_ = local_c8._8_4_;
            auVar178._8_4_ = local_c8._8_4_;
            auVar178._12_4_ = local_c8._8_4_;
            _local_e8 = blendvps(_local_e8,auVar178,auVar28);
            auVar179._4_4_ = local_c8._12_4_;
            auVar179._0_4_ = local_c8._12_4_;
            auVar179._8_4_ = local_c8._12_4_;
            auVar179._12_4_ = local_c8._12_4_;
            _local_278 = blendvps(_local_278,auVar179,auVar28);
            uVar79 = auVar268._0_4_;
            uVar101 = auVar268._4_4_;
            uVar102 = auVar268._8_4_;
            uVar103 = auVar268._12_4_;
            auVar180._4_4_ = uVar79;
            auVar180._0_4_ = uVar79;
            auVar180._8_4_ = uVar79;
            auVar180._12_4_ = uVar79;
            _local_158 = blendvps(_local_158,auVar180,auVar28);
            auVar181._4_4_ = uVar101;
            auVar181._0_4_ = uVar101;
            auVar181._8_4_ = uVar101;
            auVar181._12_4_ = uVar101;
            _local_148 = blendvps(_local_148,auVar181,auVar28);
            auVar182._4_4_ = uVar102;
            auVar182._0_4_ = uVar102;
            auVar182._8_4_ = uVar102;
            auVar182._12_4_ = uVar102;
            _local_138 = blendvps(_local_138,auVar182,auVar28);
            auVar183._4_4_ = uVar103;
            auVar183._0_4_ = uVar103;
            auVar183._8_4_ = uVar103;
            auVar183._12_4_ = uVar103;
            local_118 = blendvps(local_118,auVar183,auVar28);
            _local_2a8 = _local_2a8 ^ auVar28;
          }
          auVar113._0_4_ =
               local_278._0_4_ * (float)local_218._0_4_ +
               local_208._0_4_ * (float)local_1e8._0_4_ +
               local_198._0_4_ * (float)local_228._0_4_ + local_118._0_4_ * (float)local_168._0_4_;
          auVar113._4_4_ =
               local_278._4_4_ * (float)local_218._4_4_ +
               local_208._4_4_ * (float)local_1e8._4_4_ +
               local_198._4_4_ * (float)local_228._4_4_ + local_118._4_4_ * (float)local_168._4_4_;
          auVar113._8_4_ =
               local_278._8_4_ * fStack_210 +
               local_208._8_4_ * fStack_1e0 +
               local_198._8_4_ * fStack_220 + local_118._8_4_ * fStack_160;
          auVar113._12_4_ =
               local_278._12_4_ * fStack_20c +
               local_208._12_4_ * fStack_1dc +
               local_198._12_4_ * fStack_21c + local_118._12_4_ * fStack_15c;
          uVar15 = CONCAT44(auVar113._4_4_,auVar113._0_4_);
          auVar235._0_8_ = uVar15 ^ 0x8000000080000000;
          auVar235._8_4_ = -auVar113._8_4_;
          auVar235._12_4_ = -auVar113._12_4_;
          auVar29._4_4_ = -(uint)(auVar113._4_4_ < -auVar113._4_4_);
          auVar29._0_4_ = -(uint)(auVar113._0_4_ < -auVar113._0_4_);
          auVar29._8_4_ = -(uint)(auVar113._8_4_ < auVar235._8_4_);
          auVar29._12_4_ = -(uint)(auVar113._12_4_ < auVar235._12_4_);
          auVar93._0_8_ = local_118._0_8_ ^ 0x8000000080000000;
          auVar93._8_4_ = -local_118._8_4_;
          auVar93._12_4_ = -local_118._12_4_;
          auVar322 = blendvps(local_118,auVar93,auVar29);
          auVar94._0_8_ = local_198 ^ 0x8000000080000000;
          auVar94._8_4_ = -local_198._8_4_;
          auVar94._12_4_ = -local_198._12_4_;
          auVar325 = blendvps(_local_198,auVar94,auVar29);
          auVar95._0_8_ = local_208 ^ 0x8000000080000000;
          auVar95._8_4_ = -local_208._8_4_;
          auVar95._12_4_ = -local_208._12_4_;
          auVar129 = blendvps(_local_208,auVar95,auVar29);
          auVar96._0_8_ = local_278 ^ 0x8000000080000000;
          auVar96._8_4_ = -local_278._8_4_;
          auVar96._12_4_ = -local_278._12_4_;
          auVar107 = blendvps(_local_278,auVar96,auVar29);
          auVar217 = maxps(auVar235,auVar113);
          fVar266 = ABS(auVar113._0_4_);
          fVar280 = ABS(auVar113._4_4_);
          uVar15 = CONCAT44(auVar113._4_4_,auVar113._0_4_);
          auVar114._0_8_ = uVar15 & 0x7fffffff7fffffff;
          auVar114._8_4_ = ABS(auVar113._8_4_);
          auVar114._12_4_ = ABS(auVar113._12_4_);
          auVar97._0_4_ = 1.0 - fVar266;
          auVar97._4_4_ = 1.0 - fVar280;
          auVar97._8_4_ = 1.0 - auVar114._8_4_;
          auVar97._12_4_ = 1.0 - auVar114._12_4_;
          auVar268 = sqrtps(auVar97,auVar97);
          auVar30._0_4_ =
               1.5707964 -
               auVar268._0_4_ *
               (((((fVar266 * -0.0043095737 + 0.0192803) * fVar266 + -0.04489909) * fVar266 +
                 0.08785567) * fVar266 + -0.21450998) * fVar266 + 1.5707952);
          auVar30._4_4_ =
               1.5707964 -
               auVar268._4_4_ *
               (((((fVar280 * -0.0043095737 + 0.0192803) * fVar280 + -0.04489909) * fVar280 +
                 0.08785567) * fVar280 + -0.21450998) * fVar280 + 1.5707952);
          auVar30._8_4_ =
               1.5707964 -
               auVar268._8_4_ *
               (((((auVar114._8_4_ * -0.0043095737 + 0.0192803) * auVar114._8_4_ + -0.04489909) *
                  auVar114._8_4_ + 0.08785567) * auVar114._8_4_ + -0.21450998) * auVar114._8_4_ +
               1.5707952);
          auVar30._12_4_ =
               1.5707964 -
               auVar268._12_4_ *
               (((((auVar114._12_4_ * -0.0043095737 + 0.0192803) * auVar114._12_4_ + -0.04489909) *
                  auVar114._12_4_ + 0.08785567) * auVar114._12_4_ + -0.21450998) * auVar114._12_4_ +
               1.5707952);
          auVar268 = maxps(ZEXT816(0),auVar30);
          fVar185 = auVar217._0_4_;
          fVar187 = auVar217._4_4_;
          fVar193 = auVar217._8_4_;
          fVar195 = auVar217._12_4_;
          auVar31._4_4_ = -(uint)(fVar187 < 0.0);
          auVar31._0_4_ = -(uint)(fVar185 < 0.0);
          auVar31._8_4_ = -(uint)(fVar193 < 0.0);
          auVar31._12_4_ = -(uint)(fVar195 < 0.0);
          auVar98._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar98._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar98._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar268 = blendvps(auVar268,auVar98,auVar31);
          auVar99._0_4_ = 1.5707964 - auVar268._0_4_;
          auVar99._4_4_ = 1.5707964 - auVar268._4_4_;
          auVar99._8_4_ = 1.5707964 - auVar268._8_4_;
          auVar99._12_4_ = 1.5707964 - auVar268._12_4_;
          auVar32._4_4_ = -(uint)(1.0 < fVar280);
          auVar32._0_4_ = -(uint)(1.0 < fVar266);
          auVar32._8_4_ = -(uint)(1.0 < auVar114._8_4_);
          auVar32._12_4_ = -(uint)(1.0 < auVar114._12_4_);
          auVar268 = blendvps(auVar99,_DAT_01f4bc50,auVar32);
          fVar266 = auVar268._0_4_ * auVar304._0_4_;
          fVar280 = auVar268._4_4_ * auVar304._4_4_;
          fVar282 = auVar268._8_4_ * auVar304._8_4_;
          fVar284 = auVar268._12_4_ * auVar304._12_4_;
          auVar33._0_4_ = fVar266 * 0.63661975;
          auVar33._4_4_ = fVar280 * 0.63661975;
          auVar33._8_4_ = fVar282 * 0.63661975;
          auVar33._12_4_ = fVar284 * 0.63661975;
          auVar268 = roundps(auVar114,auVar33,1);
          uVar10 = (uint)auVar268._0_4_;
          uVar37 = (uint)auVar268._4_4_;
          uVar38 = (uint)auVar268._8_4_;
          uVar42 = (uint)auVar268._12_4_;
          fVar266 = fVar266 - auVar268._0_4_ * 1.5707964;
          fVar280 = fVar280 - auVar268._4_4_ * 1.5707964;
          fVar282 = fVar282 - auVar268._8_4_ * 1.5707964;
          fVar284 = fVar284 - auVar268._12_4_ * 1.5707964;
          uVar36 = uVar10 & 3;
          uVar41 = uVar37 & 3;
          uVar39 = uVar38 & 3;
          uVar43 = uVar42 & 3;
          fVar104 = fVar266 * fVar266;
          fVar105 = fVar280 * fVar280;
          fVar118 = fVar282 * fVar282;
          fVar78 = fVar284 * fVar284;
          uVar10 = uVar10 & 1;
          uVar37 = uVar37 & 1;
          uVar38 = uVar38 & 1;
          uVar42 = uVar42 & 1;
          auVar136._0_4_ = -(uint)(uVar10 == 0);
          auVar136._4_4_ = -(uint)(uVar37 == 0);
          auVar136._8_4_ = -(uint)(uVar38 == 0);
          auVar136._12_4_ = -(uint)(uVar42 == 0);
          auVar225._4_4_ = -uVar37;
          auVar225._0_4_ = -uVar10;
          auVar225._8_4_ = -uVar38;
          auVar225._12_4_ = -uVar42;
          auVar278._0_8_ =
               CONCAT44((((((fVar105 * -2.5029328e-08 + 2.7600126e-06) * fVar105 + -0.00019842605) *
                           fVar105 + 0.008333348) * fVar105 + -0.16666667) * fVar105 + 1.0) *
                        fVar280,(((((fVar104 * -2.5029328e-08 + 2.7600126e-06) * fVar104 +
                                   -0.00019842605) * fVar104 + 0.008333348) * fVar104 + -0.16666667)
                                 * fVar104 + 1.0) * fVar266);
          auVar278._8_4_ =
               (((((fVar118 * -2.5029328e-08 + 2.7600126e-06) * fVar118 + -0.00019842605) * fVar118
                 + 0.008333348) * fVar118 + -0.16666667) * fVar118 + 1.0) * fVar282;
          auVar278._12_4_ =
               (((((fVar78 * -2.5029328e-08 + 2.7600126e-06) * fVar78 + -0.00019842605) * fVar78 +
                 0.008333348) * fVar78 + -0.16666667) * fVar78 + 1.0) * fVar284;
          auVar191._0_4_ =
               ((((fVar104 * -2.5963018e-07 + 2.4756235e-05) * fVar104 + -0.001388833) * fVar104 +
                0.04166664) * fVar104 + -0.5) * fVar104 + 1.0;
          auVar191._4_4_ =
               ((((fVar105 * -2.5963018e-07 + 2.4756235e-05) * fVar105 + -0.001388833) * fVar105 +
                0.04166664) * fVar105 + -0.5) * fVar105 + 1.0;
          auVar191._8_4_ =
               ((((fVar118 * -2.5963018e-07 + 2.4756235e-05) * fVar118 + -0.001388833) * fVar118 +
                0.04166664) * fVar118 + -0.5) * fVar118 + 1.0;
          auVar191._12_4_ =
               ((((fVar78 * -2.5963018e-07 + 2.4756235e-05) * fVar78 + -0.001388833) * fVar78 +
                0.04166664) * fVar78 + -0.5) * fVar78 + 1.0;
          auVar293._8_4_ = auVar278._8_4_;
          auVar293._0_8_ = auVar278._0_8_;
          auVar293._12_4_ = auVar278._12_4_;
          auVar217 = blendvps(auVar293,auVar191,auVar225);
          auVar268 = blendvps(auVar278,auVar191,auVar136);
          auVar34._0_4_ = -(uint)(1 < uVar36);
          auVar34._4_4_ = -(uint)(1 < uVar41);
          auVar34._8_4_ = -(uint)(1 < uVar39);
          auVar34._12_4_ = -(uint)(1 < uVar43);
          auVar137._0_8_ = auVar217._0_8_ ^ 0x8000000080000000;
          auVar137._8_4_ = auVar217._8_4_ ^ 0x80000000;
          auVar137._12_4_ = auVar217._12_4_ ^ 0x80000000;
          auVar260 = blendvps(auVar217,auVar137,auVar34);
          uVar36 = uVar36 - 1;
          uVar41 = uVar41 - 1;
          uVar39 = uVar39 - 1;
          uVar43 = uVar43 - 1;
          auVar115._0_4_ = -(uint)(((uVar36 == 0) * uVar36 | (uint)(uVar36 != 0)) == uVar36);
          auVar115._4_4_ = -(uint)(((uVar41 == 0) * uVar41 | (uint)(uVar41 != 0)) == uVar41);
          auVar115._8_4_ = -(uint)(((uVar39 == 0) * uVar39 | (uint)(uVar39 != 0)) == uVar39);
          auVar115._12_4_ = -(uint)(((uVar43 == 0) * uVar43 | (uint)(uVar43 != 0)) == uVar43);
          auVar75._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar75._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar75._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar217 = blendvps(auVar268,auVar75,auVar115);
          fVar266 = (float)local_168._0_4_ * fVar185 - auVar322._0_4_;
          fVar280 = (float)local_168._4_4_ * fVar187 - auVar322._4_4_;
          fVar282 = fStack_160 * fVar193 - auVar322._8_4_;
          fVar284 = fStack_15c * fVar195 - auVar322._12_4_;
          fVar121 = (float)local_228._0_4_ * fVar185 - auVar325._0_4_;
          fVar122 = (float)local_228._4_4_ * fVar187 - auVar325._4_4_;
          fVar124 = fStack_220 * fVar193 - auVar325._8_4_;
          fVar125 = fStack_21c * fVar195 - auVar325._12_4_;
          local_208._0_4_ = auVar129._0_4_;
          local_208._4_4_ = auVar129._4_4_;
          fStack_200 = auVar129._8_4_;
          fStack_1fc = auVar129._12_4_;
          fVar138 = (float)local_1e8._0_4_ * fVar185 - (float)local_208._0_4_;
          fVar139 = (float)local_1e8._4_4_ * fVar187 - (float)local_208._4_4_;
          fVar140 = fStack_1e0 * fVar193 - fStack_200;
          fVar141 = fStack_1dc * fVar195 - fStack_1fc;
          local_278._0_4_ = auVar107._0_4_;
          local_278._4_4_ = auVar107._4_4_;
          fStack_270 = auVar107._8_4_;
          fStack_26c = auVar107._12_4_;
          fVar240 = (float)local_218._0_4_ * fVar185 - (float)local_278._0_4_;
          fVar241 = (float)local_218._4_4_ * fVar187 - (float)local_278._4_4_;
          fVar242 = fStack_210 * fVar193 - fStack_270;
          fVar243 = fStack_20c * fVar195 - fStack_26c;
          auVar76._0_4_ =
               fVar240 * fVar240 + fVar138 * fVar138 + fVar121 * fVar121 + fVar266 * fVar266;
          auVar76._4_4_ =
               fVar241 * fVar241 + fVar139 * fVar139 + fVar122 * fVar122 + fVar280 * fVar280;
          auVar76._8_4_ =
               fVar242 * fVar242 + fVar140 * fVar140 + fVar124 * fVar124 + fVar282 * fVar282;
          auVar76._12_4_ =
               fVar243 * fVar243 + fVar141 * fVar141 + fVar125 * fVar125 + fVar284 * fVar284;
          auVar268 = rsqrtps(auVar191,auVar76);
          fVar104 = auVar268._0_4_;
          fVar105 = auVar268._4_4_;
          fVar118 = auVar268._8_4_;
          fVar78 = auVar268._12_4_;
          fVar142 = fVar104 * 1.5 - fVar104 * fVar104 * auVar76._0_4_ * 0.5 * fVar104;
          fVar143 = fVar105 * 1.5 - fVar105 * fVar105 * auVar76._4_4_ * 0.5 * fVar105;
          fVar144 = fVar118 * 1.5 - fVar118 * fVar118 * auVar76._8_4_ * 0.5 * fVar118;
          fVar184 = fVar78 * 1.5 - fVar78 * fVar78 * auVar76._12_4_ * 0.5 * fVar78;
          fVar213 = auVar260._0_4_;
          fVar226 = auVar260._4_4_;
          fVar227 = auVar260._8_4_;
          fVar237 = auVar260._12_4_;
          fVar197 = auVar217._0_4_;
          fVar198 = auVar217._4_4_;
          fVar211 = auVar217._8_4_;
          fVar212 = auVar217._12_4_;
          local_2a8._4_4_ = (float)local_168._4_4_ * fVar198 - fVar280 * fVar143 * fVar226;
          local_2a8._0_4_ = (float)local_168._0_4_ * fVar197 - fVar266 * fVar142 * fVar213;
          uStack_2a0._0_4_ = fStack_160 * fVar211 - fVar282 * fVar144 * fVar227;
          uStack_2a0._4_4_ = fStack_15c * fVar212 - fVar284 * fVar184 * fVar237;
          fVar238 = (auVar322._0_4_ - (float)local_168._0_4_) * auVar304._0_4_ +
                    (float)local_168._0_4_;
          fVar239 = (auVar322._4_4_ - (float)local_168._4_4_) * auVar304._4_4_ +
                    (float)local_168._4_4_;
          fStack_160 = (auVar322._8_4_ - fStack_160) * auVar304._8_4_ + fStack_160;
          fStack_15c = (auVar322._12_4_ - fStack_15c) * auVar304._12_4_ + fStack_15c;
          fVar188 = (auVar325._0_4_ - (float)local_228._0_4_) * auVar304._0_4_ +
                    (float)local_228._0_4_;
          fVar252 = (auVar325._4_4_ - (float)local_228._4_4_) * auVar304._4_4_ +
                    (float)local_228._4_4_;
          fVar186 = (auVar325._8_4_ - fStack_220) * auVar304._8_4_ + fStack_220;
          fVar194 = (auVar325._12_4_ - fStack_21c) * auVar304._12_4_ + fStack_21c;
          fVar266 = ((float)local_208._0_4_ - (float)local_1e8._0_4_) * auVar304._0_4_ +
                    (float)local_1e8._0_4_;
          fVar280 = ((float)local_208._4_4_ - (float)local_1e8._4_4_) * auVar304._4_4_ +
                    (float)local_1e8._4_4_;
          fVar282 = (fStack_200 - fStack_1e0) * auVar304._8_4_ + fStack_1e0;
          fVar284 = (fStack_1fc - fStack_1dc) * auVar304._12_4_ + fStack_1dc;
          auVar116._0_4_ = fVar266 * fVar266 + fVar188 * fVar188 + fVar238 * fVar238;
          auVar116._4_4_ = fVar280 * fVar280 + fVar252 * fVar252 + fVar239 * fVar239;
          auVar116._8_4_ = fVar282 * fVar282 + fVar186 * fVar186 + fStack_160 * fStack_160;
          auVar116._12_4_ = fVar284 * fVar284 + fVar194 * fVar194 + fStack_15c * fStack_15c;
          fVar104 = ((float)local_278._0_4_ - (float)local_218._0_4_) * auVar304._0_4_ +
                    (float)local_218._0_4_;
          fVar105 = ((float)local_278._4_4_ - (float)local_218._4_4_) * auVar304._4_4_ +
                    (float)local_218._4_4_;
          fVar118 = (fStack_270 - fStack_210) * auVar304._8_4_ + fStack_210;
          fVar78 = (fStack_26c - fStack_20c) * auVar304._12_4_ + fStack_20c;
          auVar77._0_4_ = fVar104 * fVar104 + auVar116._0_4_;
          auVar77._4_4_ = fVar105 * fVar105 + auVar116._4_4_;
          auVar77._8_4_ = fVar118 * fVar118 + auVar116._8_4_;
          auVar77._12_4_ = fVar78 * fVar78 + auVar116._12_4_;
          auVar268 = rsqrtps(auVar116,auVar77);
          fVar196 = auVar268._0_4_;
          fVar119 = auVar268._4_4_;
          fVar123 = auVar268._8_4_;
          fVar120 = auVar268._12_4_;
          fVar196 = fVar196 * 1.5 - fVar196 * fVar196 * auVar77._0_4_ * 0.5 * fVar196;
          fVar119 = fVar119 * 1.5 - fVar119 * fVar119 * auVar77._4_4_ * 0.5 * fVar119;
          fVar123 = fVar123 * 1.5 - fVar123 * fVar123 * auVar77._8_4_ * 0.5 * fVar123;
          fVar120 = fVar120 * 1.5 - fVar120 * fVar120 * auVar77._12_4_ * 0.5 * fVar120;
          auVar308._0_4_ = fVar238 * fVar196;
          auVar308._4_4_ = fVar239 * fVar119;
          auVar308._8_4_ = fStack_160 * fVar123;
          auVar308._12_4_ = fStack_15c * fVar120;
          auVar35._4_4_ = -(uint)(0.9995 < fVar187);
          auVar35._0_4_ = -(uint)(0.9995 < fVar185);
          auVar35._8_4_ = -(uint)(0.9995 < fVar193);
          auVar35._12_4_ = -(uint)(0.9995 < fVar195);
          auVar268 = blendvps(_local_2a8,auVar308,auVar35);
          auVar117._0_4_ = (float)local_228._0_4_ * fVar197 - fVar121 * fVar142 * fVar213;
          auVar117._4_4_ = (float)local_228._4_4_ * fVar198 - fVar122 * fVar143 * fVar226;
          auVar117._8_4_ = fStack_220 * fVar211 - fVar124 * fVar144 * fVar227;
          auVar117._12_4_ = fStack_21c * fVar212 - fVar125 * fVar184 * fVar237;
          auVar100._0_4_ = fVar188 * fVar196;
          auVar100._4_4_ = fVar252 * fVar119;
          auVar100._8_4_ = fVar186 * fVar123;
          auVar100._12_4_ = fVar194 * fVar120;
          auVar107 = blendvps(auVar117,auVar100,auVar35);
          auVar192._0_4_ = (float)local_1e8._0_4_ * fVar197 - fVar138 * fVar142 * fVar213;
          auVar192._4_4_ = (float)local_1e8._4_4_ * fVar198 - fVar139 * fVar143 * fVar226;
          auVar192._8_4_ = fStack_1e0 * fVar211 - fVar140 * fVar144 * fVar227;
          auVar192._12_4_ = fStack_1dc * fVar212 - fVar141 * fVar184 * fVar237;
          auVar210._0_4_ = fVar266 * fVar196;
          auVar210._4_4_ = fVar280 * fVar119;
          auVar210._8_4_ = fVar282 * fVar123;
          auVar210._12_4_ = fVar284 * fVar120;
          auVar129 = blendvps(auVar192,auVar210,auVar35);
          auVar279._0_4_ = fVar197 * (float)local_218._0_4_ - fVar142 * fVar240 * fVar213;
          auVar279._4_4_ = fVar198 * (float)local_218._4_4_ - fVar143 * fVar241 * fVar226;
          auVar279._8_4_ = fVar211 * fStack_210 - fVar144 * fVar242 * fVar227;
          auVar279._12_4_ = fVar212 * fStack_20c - fVar184 * fVar243 * fVar237;
          auVar236._0_4_ = fVar196 * fVar104;
          auVar236._4_4_ = fVar119 * fVar105;
          auVar236._8_4_ = fVar123 * fVar118;
          auVar236._12_4_ = fVar120 * fVar78;
          auVar217 = blendvps(auVar279,auVar236,auVar35);
          fVar266 = 1.0 - auVar304._0_4_;
          fVar280 = 1.0 - auVar304._4_4_;
          fVar282 = 1.0 - auVar304._8_4_;
          fVar284 = 1.0 - auVar304._12_4_;
          local_288._4_4_ =
               (float)local_288._4_4_ * fVar280 + (float)local_b8._4_4_ * auVar304._4_4_;
          local_288._0_4_ =
               (float)local_288._0_4_ * fVar266 + (float)local_b8._0_4_ * auVar304._0_4_;
          fStack_280 = fStack_280 * fVar282 + fStack_b0 * auVar304._8_4_;
          fStack_27c = fStack_27c * fVar284 + fStack_ac * auVar304._12_4_;
          local_258._4_4_ =
               (float)local_258._4_4_ * fVar280 + (float)local_a8._4_4_ * auVar304._4_4_;
          local_258._0_4_ =
               (float)local_258._0_4_ * fVar266 + (float)local_a8._0_4_ * auVar304._0_4_;
          uStack_250._0_4_ = (float)uStack_250 * fVar282 + fStack_a0 * auVar304._8_4_;
          uStack_250._4_4_ = uStack_250._4_4_ * fVar284 + fStack_9c * auVar304._12_4_;
          local_248._4_4_ =
               (float)local_248._4_4_ * fVar280 + (float)local_98._4_4_ * auVar304._4_4_;
          local_248._0_4_ =
               (float)local_248._0_4_ * fVar266 + (float)local_98._0_4_ * auVar304._0_4_;
          uStack_240._0_4_ = (float)uStack_240 * fVar282 + fStack_90 * auVar304._8_4_;
          uStack_240._4_4_ = uStack_240._4_4_ * fVar284 + fStack_8c * auVar304._12_4_;
          local_238._4_4_ =
               (float)local_238._4_4_ * fVar280 + (float)local_88._4_4_ * auVar304._4_4_;
          local_238._0_4_ =
               (float)local_238._0_4_ * fVar266 + (float)local_88._0_4_ * auVar304._0_4_;
          uStack_230._0_4_ = (float)uStack_230 * fVar282 + fStack_80 * auVar304._8_4_;
          uStack_230._4_4_ = uStack_230._4_4_ * fVar284 + fStack_7c * auVar304._12_4_;
          local_1d8._4_4_ =
               (float)local_1d8._4_4_ * fVar280 + (float)local_78._4_4_ * auVar304._4_4_;
          local_1d8._0_4_ =
               (float)local_1d8._0_4_ * fVar266 + (float)local_78._0_4_ * auVar304._0_4_;
          fStack_1d0 = fStack_1d0 * fVar282 + fStack_70 * auVar304._8_4_;
          fStack_1cc = fStack_1cc * fVar284 + fStack_6c * auVar304._12_4_;
          local_268._4_4_ =
               (float)local_268._4_4_ * fVar280 + (float)local_108._4_4_ * auVar304._4_4_;
          local_268._0_4_ =
               (float)local_268._0_4_ * fVar266 + (float)local_108._0_4_ * auVar304._0_4_;
          uStack_260._0_4_ = (float)uStack_260 * fVar282 + fStack_100 * auVar304._8_4_;
          uStack_260._4_4_ = uStack_260._4_4_ * fVar284 + fStack_fc * auVar304._12_4_;
          local_298._4_4_ =
               (float)local_298._4_4_ * fVar280 + (float)local_f8._4_4_ * auVar304._4_4_;
          local_298._0_4_ =
               (float)local_298._0_4_ * fVar266 + (float)local_f8._0_4_ * auVar304._0_4_;
          fStack_290 = fStack_290 * fVar282 + fStack_f0 * auVar304._8_4_;
          fStack_28c = fStack_28c * fVar284 + fStack_ec * auVar304._12_4_;
          local_1b8._4_4_ =
               (float)local_1b8._4_4_ * fVar280 + (float)local_178._4_4_ * auVar304._4_4_;
          local_1b8._0_4_ =
               (float)local_1b8._0_4_ * fVar266 + (float)local_178._0_4_ * auVar304._0_4_;
          fStack_1b0 = fStack_1b0 * fVar282 + fStack_170 * auVar304._8_4_;
          fStack_1ac = fStack_1ac * fVar284 + fStack_16c * auVar304._12_4_;
          local_1c8._4_4_ =
               (float)local_1c8._4_4_ * fVar280 + (float)local_e8._4_4_ * auVar304._4_4_;
          local_1c8._0_4_ =
               (float)local_1c8._0_4_ * fVar266 + (float)local_e8._0_4_ * auVar304._0_4_;
          fStack_1c0 = fStack_1c0 * fVar282 + fStack_e0 * auVar304._8_4_;
          fStack_1bc = fStack_1bc * fVar284 + fStack_dc * auVar304._12_4_;
          local_1f8._4_4_ =
               (float)local_1f8._4_4_ * fVar280 + (float)local_158._4_4_ * auVar304._4_4_;
          local_1f8._0_4_ =
               (float)local_1f8._0_4_ * fVar266 + (float)local_158._0_4_ * auVar304._0_4_;
          uStack_1f0._0_4_ = (float)uStack_1f0 * fVar282 + fStack_150 * auVar304._8_4_;
          uStack_1f0._4_4_ = uStack_1f0._4_4_ * fVar284 + fStack_14c * auVar304._12_4_;
          local_1a8._4_4_ =
               (float)local_1a8._4_4_ * fVar280 + (float)local_148._4_4_ * auVar304._4_4_;
          local_1a8._0_4_ =
               (float)local_1a8._0_4_ * fVar266 + (float)local_148._0_4_ * auVar304._0_4_;
          fStack_1a0 = fStack_1a0 * fVar282 + fStack_140 * auVar304._8_4_;
          fStack_19c = fStack_19c * fVar284 + fStack_13c * auVar304._12_4_;
          local_208._4_4_ =
               fVar280 * (float)local_188._4_4_ + (float)local_138._4_4_ * auVar304._4_4_;
          local_208._0_4_ =
               fVar266 * (float)local_188._0_4_ + (float)local_138._0_4_ * auVar304._0_4_;
          fStack_200 = fVar282 * fStack_180 + fStack_130 * auVar304._8_4_;
          fStack_1fc = fVar284 * fStack_17c + fStack_12c * auVar304._12_4_;
          fVar196 = auVar107._0_4_;
          fVar119 = auVar107._4_4_;
          fVar120 = auVar107._12_4_;
          local_2a8._0_4_ = auVar268._0_4_;
          local_2a8._4_4_ = auVar268._4_4_;
          uStack_2a0._0_4_ = auVar268._8_4_;
          uStack_2a0._4_4_ = auVar268._12_4_;
          fVar123 = auVar107._8_4_;
          fVar139 = auVar129._0_4_;
          fVar141 = auVar129._4_4_;
          fVar143 = auVar129._8_4_;
          fVar184 = auVar129._12_4_;
          fVar104 = auVar217._0_4_;
          fVar118 = auVar217._4_4_;
          fVar188 = auVar217._8_4_;
          fVar186 = auVar217._12_4_;
          fVar266 = fVar196 * fVar139 + (float)local_2a8._0_4_ * fVar104;
          fVar280 = fVar119 * fVar141 + (float)local_2a8._4_4_ * fVar118;
          fVar282 = fVar123 * fVar143 + (float)uStack_2a0 * fVar188;
          fVar284 = fVar120 * fVar184 + uStack_2a0._4_4_ * fVar186;
          fVar238 = fVar196 * fVar139 - (float)local_2a8._0_4_ * fVar104;
          fVar239 = fVar119 * fVar141 - (float)local_2a8._4_4_ * fVar118;
          fVar240 = fVar123 * fVar143 - (float)uStack_2a0 * fVar188;
          fVar241 = fVar120 * fVar184 - uStack_2a0._4_4_ * fVar186;
          fVar197 = fVar139 * fVar139;
          fVar198 = fVar141 * fVar141;
          fVar211 = fVar143 * fVar143;
          fVar212 = fVar184 * fVar184;
          fVar105 = (float)local_2a8._0_4_ * (float)local_2a8._0_4_ - fVar196 * fVar196;
          fVar78 = (float)local_2a8._4_4_ * (float)local_2a8._4_4_ - fVar119 * fVar119;
          fVar252 = (float)uStack_2a0 * (float)uStack_2a0 - fVar123 * fVar123;
          fVar194 = uStack_2a0._4_4_ * uStack_2a0._4_4_ - fVar120 * fVar120;
          fVar138 = fVar196 * fVar104 - (float)local_2a8._0_4_ * fVar139;
          fVar140 = fVar119 * fVar118 - (float)local_2a8._4_4_ * fVar141;
          fVar142 = fVar123 * fVar188 - (float)uStack_2a0 * fVar143;
          fVar144 = fVar120 * fVar186 - uStack_2a0._4_4_ * fVar184;
          fVar121 = (float)local_2a8._0_4_ * fVar139 + fVar196 * fVar104;
          fVar122 = (float)local_2a8._4_4_ * fVar141 + fVar119 * fVar118;
          fVar124 = (float)uStack_2a0 * fVar143 + fVar123 * fVar188;
          fVar125 = uStack_2a0._4_4_ * fVar184 + fVar120 * fVar186;
          fVar185 = fVar104 * fVar139 + fVar196 * (float)local_2a8._0_4_;
          fVar187 = fVar118 * fVar141 + fVar119 * (float)local_2a8._4_4_;
          fVar193 = fVar188 * fVar143 + fVar123 * (float)uStack_2a0;
          fVar195 = fVar186 * fVar184 + fVar120 * uStack_2a0._4_4_;
          fVar139 = fVar104 * fVar139 - fVar196 * (float)local_2a8._0_4_;
          fVar141 = fVar118 * fVar141 - fVar119 * (float)local_2a8._4_4_;
          fVar143 = fVar188 * fVar143 - fVar123 * (float)uStack_2a0;
          fVar184 = fVar186 * fVar184 - fVar120 * uStack_2a0._4_4_;
          fVar104 = fVar104 * fVar104;
          fVar118 = fVar118 * fVar118;
          fVar188 = fVar188 * fVar188;
          fVar186 = fVar186 * fVar186;
          fVar213 = (((float)local_2a8._0_4_ * (float)local_2a8._0_4_ + fVar196 * fVar196) - fVar197
                    ) - fVar104;
          fVar226 = (((float)local_2a8._4_4_ * (float)local_2a8._4_4_ + fVar119 * fVar119) - fVar198
                    ) - fVar118;
          fVar227 = (((float)uStack_2a0 * (float)uStack_2a0 + fVar123 * fVar123) - fVar211) -
                    fVar188;
          fVar237 = ((uStack_2a0._4_4_ * uStack_2a0._4_4_ + fVar120 * fVar120) - fVar212) - fVar186;
          fVar196 = (fVar197 + fVar105) - fVar104;
          fVar119 = (fVar198 + fVar78) - fVar118;
          fVar123 = (fVar211 + fVar252) - fVar188;
          fVar120 = (fVar212 + fVar194) - fVar186;
          fVar104 = (fVar105 - fVar197) + fVar104;
          fVar118 = (fVar78 - fVar198) + fVar118;
          fVar188 = (fVar252 - fVar211) + fVar188;
          fVar186 = (fVar194 - fVar212) + fVar186;
        }
        fVar105 = (fVar138 + fVar138) * 0.0;
        fVar78 = (fVar140 + fVar140) * 0.0;
        fVar252 = (fVar142 + fVar142) * 0.0;
        fVar194 = (fVar144 + fVar144) * 0.0;
        fVar242 = (fVar266 + fVar266) * 0.0;
        fVar251 = (fVar280 + fVar280) * 0.0;
        fVar254 = (fVar282 + fVar282) * 0.0;
        fVar285 = (fVar284 + fVar284) * 0.0;
        fVar243 = fVar242 + fVar105 + fVar213;
        fVar253 = fVar251 + fVar78 + fVar226;
        fVar311 = fVar254 + fVar252 + fVar227;
        fVar294 = fVar285 + fVar194 + fVar237;
        fVar197 = fVar105 + fVar266 + fVar266 + fVar213 * 0.0;
        fVar198 = fVar78 + fVar280 + fVar280 + fVar226 * 0.0;
        fVar211 = fVar252 + fVar282 + fVar282 + fVar227 * 0.0;
        fVar212 = fVar194 + fVar284 + fVar284 + fVar237 * 0.0;
        fVar302 = fVar213 * 0.0 + fVar138 + fVar138 + fVar242;
        fVar312 = fVar226 * 0.0 + fVar140 + fVar140 + fVar251;
        fVar315 = fVar227 * 0.0 + fVar142 + fVar142 + fVar254;
        fVar318 = fVar237 * 0.0 + fVar144 + fVar144 + fVar285;
        fVar266 = (fVar185 + fVar185) * 0.0;
        fVar280 = (fVar187 + fVar187) * 0.0;
        fVar282 = (fVar193 + fVar193) * 0.0;
        fVar284 = (fVar195 + fVar195) * 0.0;
        fVar242 = fVar266 + fVar196 * 0.0 + fVar238 + fVar238;
        fVar251 = fVar280 + fVar119 * 0.0 + fVar239 + fVar239;
        fVar254 = fVar282 + fVar123 * 0.0 + fVar240 + fVar240;
        fVar285 = fVar284 + fVar120 * 0.0 + fVar241 + fVar241;
        fVar320 = (fVar238 + fVar238) * 0.0;
        fVar327 = (fVar239 + fVar239) * 0.0;
        fVar329 = (fVar240 + fVar240) * 0.0;
        fVar331 = (fVar241 + fVar241) * 0.0;
        fVar286 = fVar196 + fVar266 + fVar320;
        fVar326 = fVar119 + fVar280 + fVar327;
        fVar330 = fVar123 + fVar282 + fVar329;
        fVar298 = fVar120 + fVar284 + fVar331;
        fVar320 = fVar320 + fVar196 * 0.0 + fVar185 + fVar185;
        fVar327 = fVar327 + fVar119 * 0.0 + fVar187 + fVar187;
        fVar329 = fVar329 + fVar123 * 0.0 + fVar193 + fVar193;
        fVar331 = fVar331 + fVar120 * 0.0 + fVar195 + fVar195;
        fVar266 = (fVar139 + fVar139) * 0.0;
        fVar280 = (fVar141 + fVar141) * 0.0;
        fVar282 = (fVar143 + fVar143) * 0.0;
        fVar284 = (fVar184 + fVar184) * 0.0;
        fVar196 = fVar266 + fVar104 * 0.0 + fVar121 + fVar121;
        fVar123 = fVar280 + fVar118 * 0.0 + fVar122 + fVar122;
        fVar185 = fVar282 + fVar188 * 0.0 + fVar124 + fVar124;
        fVar193 = fVar284 + fVar186 * 0.0 + fVar125 + fVar125;
        fVar119 = (fVar121 + fVar121) * 0.0;
        fVar120 = (fVar122 + fVar122) * 0.0;
        fVar122 = (fVar124 + fVar124) * 0.0;
        fVar125 = (fVar125 + fVar125) * 0.0;
        fVar121 = fVar104 * 0.0 + fVar139 + fVar139 + fVar119;
        fVar124 = fVar118 * 0.0 + fVar141 + fVar141 + fVar120;
        fVar238 = fVar188 * 0.0 + fVar143 + fVar143 + fVar122;
        fVar239 = fVar186 * 0.0 + fVar184 + fVar184 + fVar125;
        fVar119 = fVar119 + fVar266 + fVar104;
        fVar120 = fVar120 + fVar280 + fVar118;
        fVar122 = fVar122 + fVar282 + fVar188;
        fVar125 = fVar125 + fVar284 + fVar186;
        fVar213 = (float)local_288._0_4_ * fVar243 + fVar242 * 0.0 + fVar196 * 0.0;
        fVar226 = (float)local_288._4_4_ * fVar253 + fVar251 * 0.0 + fVar123 * 0.0;
        fVar227 = fStack_280 * fVar311 + fVar254 * 0.0 + fVar185 * 0.0;
        fVar237 = fStack_27c * fVar294 + fVar285 * 0.0 + fVar193 * 0.0;
        fVar240 = (float)local_288._0_4_ * fVar197 + fVar286 * 0.0 + fVar121 * 0.0;
        fVar241 = (float)local_288._4_4_ * fVar198 + fVar326 * 0.0 + fVar124 * 0.0;
        fVar295 = fStack_280 * fVar211 + fVar330 * 0.0 + fVar238 * 0.0;
        fVar297 = fStack_27c * fVar212 + fVar298 * 0.0 + fVar239 * 0.0;
        fVar142 = (float)local_288._0_4_ * fVar302 + fVar320 * 0.0 + fVar119 * 0.0;
        fVar144 = (float)local_288._4_4_ * fVar312 + fVar327 * 0.0 + fVar120 * 0.0;
        fVar187 = fStack_280 * fVar315 + fVar329 * 0.0 + fVar122 * 0.0;
        fVar195 = fStack_27c * fVar318 + fVar331 * 0.0 + fVar125 * 0.0;
        fVar301 = (float)local_238._0_4_ * fVar243 +
                  (float)local_1d8._0_4_ * fVar242 + fVar196 * 0.0;
        fVar310 = (float)local_238._4_4_ * fVar253 +
                  (float)local_1d8._4_4_ * fVar251 + fVar123 * 0.0;
        fVar314 = (float)uStack_230 * fVar311 + fStack_1d0 * fVar254 + fVar185 * 0.0;
        fVar317 = uStack_230._4_4_ * fVar294 + fStack_1cc * fVar285 + fVar193 * 0.0;
        fVar188 = (float)local_238._0_4_ * fVar197 +
                  (float)local_1d8._0_4_ * fVar286 + fVar121 * 0.0;
        fVar252 = (float)local_238._4_4_ * fVar198 +
                  (float)local_1d8._4_4_ * fVar326 + fVar124 * 0.0;
        fVar186 = (float)uStack_230 * fVar211 + fStack_1d0 * fVar330 + fVar238 * 0.0;
        fVar194 = uStack_230._4_4_ * fVar212 + fStack_1cc * fVar298 + fVar239 * 0.0;
        fVar266 = (float)local_238._0_4_ * fVar302 +
                  (float)local_1d8._0_4_ * fVar320 + fVar119 * 0.0;
        fVar282 = (float)local_238._4_4_ * fVar312 +
                  (float)local_1d8._4_4_ * fVar327 + fVar120 * 0.0;
        fVar104 = (float)uStack_230 * fVar315 + fStack_1d0 * fVar329 + fVar122 * 0.0;
        fVar118 = uStack_230._4_4_ * fVar318 + fStack_1cc * fVar331 + fVar125 * 0.0;
        fVar138 = (float)local_298._0_4_ * fVar243 +
                  (float)local_1b8._0_4_ * fVar242 + (float)local_1c8._0_4_ * fVar196;
        fVar139 = (float)local_298._4_4_ * fVar253 +
                  (float)local_1b8._4_4_ * fVar251 + (float)local_1c8._4_4_ * fVar123;
        fVar140 = fStack_290 * fVar311 + fStack_1b0 * fVar254 + fStack_1c0 * fVar185;
        fVar141 = fStack_28c * fVar294 + fStack_1ac * fVar285 + fStack_1bc * fVar193;
        fVar319 = (float)local_298._0_4_ * fVar197 +
                  (float)local_1b8._0_4_ * fVar286 + (float)local_1c8._0_4_ * fVar121;
        fVar328 = (float)local_298._4_4_ * fVar198 +
                  (float)local_1b8._4_4_ * fVar326 + (float)local_1c8._4_4_ * fVar124;
        fVar296 = fStack_290 * fVar211 + fStack_1b0 * fVar330 + fStack_1c0 * fVar238;
        fVar299 = fStack_28c * fVar212 + fStack_1ac * fVar298 + fStack_1bc * fVar239;
        fVar280 = (float)local_298._0_4_ * fVar302 +
                  (float)local_1b8._0_4_ * fVar320 + (float)local_1c8._0_4_ * fVar119;
        fVar284 = (float)local_298._4_4_ * fVar312 +
                  (float)local_1b8._4_4_ * fVar327 + (float)local_1c8._4_4_ * fVar120;
        fVar105 = fStack_290 * fVar315 + fStack_1b0 * fVar329 + fStack_1c0 * fVar122;
        fVar78 = fStack_28c * fVar318 + fStack_1ac * fVar331 + fStack_1bc * fVar125;
        fVar143 = fVar243 * (float)local_1f8._0_4_ +
                  fVar242 * (float)local_1a8._0_4_ + fVar196 * (float)local_208._0_4_ +
                  (float)local_258._0_4_ + 0.0;
        fVar184 = fVar253 * (float)local_1f8._4_4_ +
                  fVar251 * (float)local_1a8._4_4_ + fVar123 * (float)local_208._4_4_ +
                  (float)local_258._4_4_ + 0.0;
        fVar185 = fVar311 * (float)uStack_1f0 + fVar254 * fStack_1a0 + fVar185 * fStack_200 +
                  (float)uStack_250 + 0.0;
        fVar193 = fVar294 * uStack_1f0._4_4_ + fVar285 * fStack_19c + fVar193 * fStack_1fc +
                  uStack_250._4_4_ + 0.0;
        fVar196 = fVar197 * (float)local_1f8._0_4_ +
                  fVar286 * (float)local_1a8._0_4_ + fVar121 * (float)local_208._0_4_ +
                  (float)local_248._0_4_ + 0.0;
        fVar123 = fVar198 * (float)local_1f8._4_4_ +
                  fVar326 * (float)local_1a8._4_4_ + fVar124 * (float)local_208._4_4_ +
                  (float)local_248._4_4_ + 0.0;
        fVar121 = fVar211 * (float)uStack_1f0 + fVar330 * fStack_1a0 + fVar238 * fStack_200 +
                  (float)uStack_240 + 0.0;
        fVar124 = fVar212 * uStack_1f0._4_4_ + fVar298 * fStack_19c + fVar239 * fStack_1fc +
                  uStack_240._4_4_ + 0.0;
        fVar119 = fVar302 * (float)local_1f8._0_4_ +
                  fVar320 * (float)local_1a8._0_4_ + fVar119 * (float)local_208._0_4_ +
                  (float)local_268._0_4_ + 0.0;
        fVar120 = fVar312 * (float)local_1f8._4_4_ +
                  fVar327 * (float)local_1a8._4_4_ + fVar120 * (float)local_208._4_4_ +
                  (float)local_268._4_4_ + 0.0;
        fVar122 = fVar315 * (float)uStack_1f0 + fVar329 * fStack_1a0 + fVar122 * fStack_200 +
                  (float)uStack_260 + 0.0;
        fVar125 = fVar318 * uStack_1f0._4_4_ + fVar331 * fStack_19c + fVar125 * fStack_1fc +
                  uStack_260._4_4_ + 0.0;
        auVar135._0_4_ = fVar188 * fVar280 - fVar266 * fVar319;
        auVar135._4_4_ = fVar252 * fVar284 - fVar282 * fVar328;
        auVar135._8_4_ = fVar186 * fVar105 - fVar104 * fVar296;
        auVar135._12_4_ = fVar194 * fVar78 - fVar118 * fVar299;
        auVar223._0_4_ = fVar266 * fVar138 - fVar301 * fVar280;
        auVar223._4_4_ = fVar282 * fVar139 - fVar310 * fVar284;
        auVar223._8_4_ = fVar104 * fVar140 - fVar314 * fVar105;
        auVar223._12_4_ = fVar118 * fVar141 - fVar317 * fVar78;
        auVar250._0_4_ = fVar301 * fVar319 - fVar188 * fVar138;
        auVar250._4_4_ = fVar310 * fVar328 - fVar252 * fVar139;
        auVar250._8_4_ = fVar314 * fVar296 - fVar186 * fVar140;
        auVar250._12_4_ = fVar317 * fVar299 - fVar194 * fVar141;
        auVar234._0_4_ = fVar319 * fVar142 - fVar280 * fVar240;
        auVar234._4_4_ = fVar328 * fVar144 - fVar284 * fVar241;
        auVar234._8_4_ = fVar296 * fVar187 - fVar105 * fVar295;
        auVar234._12_4_ = fVar299 * fVar195 - fVar78 * fVar297;
        auVar27._0_4_ = fVar280 * fVar213 - fVar138 * fVar142;
        auVar27._4_4_ = fVar284 * fVar226 - fVar139 * fVar144;
        auVar27._8_4_ = fVar105 * fVar227 - fVar140 * fVar187;
        auVar27._12_4_ = fVar78 * fVar237 - fVar141 * fVar195;
        auVar151._0_4_ = fVar138 * fVar240 - fVar319 * fVar213;
        auVar151._4_4_ = fVar139 * fVar241 - fVar328 * fVar226;
        auVar151._8_4_ = fVar140 * fVar295 - fVar296 * fVar227;
        auVar151._12_4_ = fVar141 * fVar297 - fVar299 * fVar237;
        auVar307._0_4_ = fVar240 * fVar266 - fVar142 * fVar188;
        auVar307._4_4_ = fVar241 * fVar282 - fVar144 * fVar252;
        auVar307._8_4_ = fVar295 * fVar104 - fVar187 * fVar186;
        auVar307._12_4_ = fVar297 * fVar118 - fVar195 * fVar194;
        auVar324._0_4_ = fVar142 * fVar301 - fVar266 * fVar213;
        auVar324._4_4_ = fVar144 * fVar310 - fVar282 * fVar226;
        auVar324._8_4_ = fVar187 * fVar314 - fVar104 * fVar227;
        auVar324._12_4_ = fVar195 * fVar317 - fVar118 * fVar237;
        auVar290._4_4_ = fVar252 * fVar226 - fVar310 * fVar241;
        auVar290._0_4_ = fVar188 * fVar213 - fVar301 * fVar240;
        auVar290._8_4_ = fVar186 * fVar227 - fVar314 * fVar295;
        auVar290._12_4_ = fVar194 * fVar237 - fVar317 * fVar297;
        auVar209._0_4_ =
             fVar213 * auVar135._0_4_ + fVar240 * auVar223._0_4_ + fVar142 * auVar250._0_4_;
        auVar209._4_4_ =
             fVar226 * auVar135._4_4_ + fVar241 * auVar223._4_4_ + fVar144 * auVar250._4_4_;
        auVar209._8_4_ =
             fVar227 * auVar135._8_4_ + fVar295 * auVar223._8_4_ + fVar187 * auVar250._8_4_;
        auVar209._12_4_ =
             fVar237 * auVar135._12_4_ + fVar297 * auVar223._12_4_ + fVar195 * auVar250._12_4_;
        auVar129 = divps(auVar135,auVar209);
        auVar260 = divps(auVar234,auVar209);
        auVar304 = divps(auVar307,auVar209);
        auVar217 = divps(auVar223,auVar209);
        _local_298 = divps(auVar27,auVar209);
        auVar322 = divps(auVar324,auVar209);
        auVar268 = divps(auVar250,auVar209);
        _local_288 = divps(auVar151,auVar209);
        auVar107 = divps(auVar290,auVar209);
        fVar266 = fVar143 * auVar129._0_4_ + fVar196 * auVar217._0_4_ + fVar119 * auVar268._0_4_;
        fVar280 = fVar184 * auVar129._4_4_ + fVar123 * auVar217._4_4_ + fVar120 * auVar268._4_4_;
        fVar282 = fVar185 * auVar129._8_4_ + fVar121 * auVar217._8_4_ + fVar122 * auVar268._8_4_;
        fVar284 = fVar193 * auVar129._12_4_ + fVar124 * auVar217._12_4_ + fVar125 * auVar268._12_4_;
        fVar104 = fVar143 * auVar260._0_4_ + fVar196 * local_298._0_4_ + fVar119 * local_288._0_4_;
        fVar105 = fVar184 * auVar260._4_4_ + fVar123 * local_298._4_4_ + fVar120 * local_288._4_4_;
        fVar118 = fVar185 * auVar260._8_4_ + fVar121 * local_298._8_4_ + fVar122 * local_288._8_4_;
        fVar78 = fVar193 * auVar260._12_4_ + fVar124 * local_298._12_4_ + fVar125 * local_288._12_4_
        ;
        fVar188 = fVar143 * auVar304._0_4_ + fVar196 * auVar322._0_4_ + fVar119 * auVar107._0_4_;
        fVar252 = fVar184 * auVar304._4_4_ + fVar123 * auVar322._4_4_ + fVar120 * auVar107._4_4_;
        fVar186 = fVar185 * auVar304._8_4_ + fVar121 * auVar322._8_4_ + fVar122 * auVar107._8_4_;
        fVar194 = fVar193 * auVar304._12_4_ + fVar124 * auVar322._12_4_ + fVar125 * auVar107._12_4_;
      }
      else {
        fVar266 = (this->super_Geometry).fnumTimeSegments;
        fVar280 = (this->super_Geometry).time_range.lower;
        auVar80._0_4_ = (this->super_Geometry).time_range.upper - fVar280;
        auVar45._4_4_ = fVar280;
        auVar45._0_4_ = fVar280;
        auVar45._8_4_ = fVar280;
        auVar45._12_4_ = fVar280;
        auVar109._4_4_ = fVar266;
        auVar109._0_4_ = fVar266;
        auVar109._8_4_ = fVar266;
        auVar109._12_4_ = fVar266;
        auVar267._0_4_ = *(float *)(ray + 0x70) - fVar280;
        auVar267._4_4_ = *(float *)(ray + 0x74) - fVar280;
        auVar267._8_4_ = *(float *)(ray + 0x78) - fVar280;
        auVar267._12_4_ = *(float *)(ray + 0x7c) - fVar280;
        auVar80._4_4_ = auVar80._0_4_;
        auVar80._8_4_ = auVar80._0_4_;
        auVar80._12_4_ = auVar80._0_4_;
        auVar268 = divps(auVar267,auVar80);
        auVar269._0_4_ = auVar268._0_4_ * fVar266;
        auVar269._4_4_ = auVar268._4_4_ * fVar266;
        auVar269._8_4_ = auVar268._8_4_ * fVar266;
        auVar269._12_4_ = auVar268._12_4_ * fVar266;
        auVar268 = roundps(auVar45,auVar269,1);
        auVar16._0_4_ = fVar266 + -1.0;
        auVar16._4_4_ = auVar16._0_4_;
        auVar16._8_4_ = auVar16._0_4_;
        auVar16._12_4_ = auVar16._0_4_;
        auVar268 = minps(auVar268,auVar16);
        auVar268 = maxps(auVar268,ZEXT816(0));
        fVar266 = auVar269._0_4_ - auVar268._0_4_;
        fVar280 = auVar269._4_4_ - auVar268._4_4_;
        fVar282 = auVar269._8_4_ - auVar268._8_4_;
        fVar284 = auVar269._12_4_ - auVar268._12_4_;
        iVar300 = (int)auVar268._0_4_;
        iVar309 = (int)auVar268._4_4_;
        iVar313 = (int)auVar268._8_4_;
        iVar316 = (int)auVar268._12_4_;
        local_68 = (Accel *)CONCAT44(iVar309,iVar300);
        uStack_60 = (RTCRayQueryContext *)CONCAT44(iVar316,iVar313);
        lVar13 = 0;
        if ((uVar10 & 0xff) != 0) {
          for (; ((uVar10 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        iVar12 = *(int *)((long)&local_68 + lVar13 * 4);
        pRVar11 = (RawBufferView *)(long)iVar12;
        auVar17._0_4_ = -(uint)(iVar12 == iVar300);
        auVar17._4_4_ = -(uint)(iVar12 == iVar309);
        auVar17._8_4_ = -(uint)(iVar12 == iVar313);
        auVar17._12_4_ = -(uint)(iVar12 == iVar316);
        iVar12 = movmskps(uVar36 << 8,~auVar17 & local_48);
        auVar268 = local_48;
        auVar107 = local_48;
        if (iVar12 == 0) {
          pRVar5 = (this->l2w_buf).items;
          pRVar7 = pRVar5 + (long)pRVar11;
          RVar3 = pRVar5[(long)pRVar11].format;
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
            auVar126 = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
            auVar255 = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
            auVar244 = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
            auVar214 = auVar268._0_12_;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar126._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
            auVar126._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar126._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
            auVar255._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
            auVar255._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
            auVar255._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
            auVar244._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar244._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar244._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar214._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
            auVar214._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
            auVar214._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar245._8_8_ = 0;
            auVar245._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
            auVar107 = insertps(auVar245,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
            auVar127._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
            auVar127._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar127._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
            auVar127._12_4_ = 0;
            auVar215._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar215._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar215._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar215._12_4_ = 0;
            fVar104 = *(float *)(pcVar6 + lVar13 + 0x24);
            fVar105 = *(float *)(pcVar6 + lVar13 + 0x28);
            fVar118 = *(float *)(pcVar6 + lVar13 + 0x2c);
            fVar78 = *(float *)(pcVar6 + lVar13 + 0x30);
            fVar252 = fVar78 * fVar78 + fVar118 * fVar118 + fVar104 * fVar104 + fVar105 * fVar105;
            auVar268 = rsqrtss(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252));
            fVar188 = auVar268._0_4_;
            auVar228._0_4_ = fVar252 * -0.5 * fVar188;
            auVar228._4_8_ = 0;
            auVar189._4_12_ = auVar268._4_12_;
            fVar188 = fVar188 * fVar188 * auVar228._0_4_ + fVar188 * 1.5;
            auVar268 = insertps(auVar215,ZEXT416((uint)(fVar104 * fVar188)),0x30);
            auVar214 = auVar268._0_12_;
            auVar268 = insertps(auVar127,ZEXT416((uint)(fVar105 * fVar188)),0x30);
            auVar126 = auVar268._0_12_;
            auVar189._0_4_ = fVar188 * fVar78;
            auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
            auVar268 = insertps(auVar107,auVar189,0x30);
            auVar244 = auVar268._0_12_;
            auVar268 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
            auVar268 = insertps(auVar268,ZEXT416((uint)(fVar118 * fVar188)),0x30);
            auVar255 = auVar268._0_12_;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7->ptr_ofs;
            lVar13 = pRVar7->stride * uVar15;
            auVar126 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13),0);
            auVar255 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10),0);
            auVar244 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20),0);
            auVar214 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30),0);
          }
          fVar104 = auVar126._0_4_;
          fVar105 = auVar126._4_4_;
          fVar118 = auVar126._8_4_;
          fVar119 = auVar255._0_4_;
          fVar123 = auVar255._4_4_;
          auVar256._8_4_ = auVar255._8_4_;
          auVar256._4_4_ = auVar256._8_4_;
          auVar256._0_4_ = auVar256._8_4_;
          fVar186 = auVar244._0_4_;
          fVar194 = auVar244._4_4_;
          fVar196 = auVar244._8_4_;
          fVar78 = auVar214._0_4_;
          fVar188 = auVar214._4_4_;
          fVar252 = auVar214._8_4_;
          auVar44._4_4_ = fVar188;
          auVar44._0_4_ = fVar188;
          auVar44._8_4_ = fVar188;
          RVar3 = pRVar7[1].format;
          if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
            auVar44 = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
            v_15.field_0._0_12_ = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
            auVar228 = auVar268._0_12_;
            auVar268 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
            auVar268 = insertps(auVar268,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
            auVar257 = auVar268._0_12_;
          }
          else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar44._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
            auVar44._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar44._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
            v_15.field_0._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
            v_15.field_0._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
            v_15.field_0._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
            auVar228._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar228._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar228._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar257._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
            auVar257._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
            auVar257._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
          }
          else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar6 = pRVar7[1].ptr_ofs;
            lVar13 = uVar15 * pRVar7[1].stride;
            auVar229._8_8_ = 0;
            auVar229._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
            auVar107 = insertps(auVar229,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
            auVar46._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
            auVar46._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
            auVar46._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
            auVar46._12_4_ = 0;
            auVar258._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
            auVar258._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
            auVar258._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
            auVar258._12_4_ = 0;
            fVar120 = *(float *)(pcVar6 + lVar13 + 0x24);
            fVar121 = *(float *)(pcVar6 + lVar13 + 0x28);
            fVar122 = *(float *)(pcVar6 + lVar13 + 0x2c);
            fVar124 = *(float *)(pcVar6 + lVar13 + 0x30);
            fVar138 = fVar124 * fVar124 + fVar122 * fVar122 + fVar120 * fVar120 + fVar121 * fVar121;
            auVar268 = rsqrtss(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138));
            fVar125 = auVar268._0_4_;
            auVar81._4_12_ = auVar268._4_12_;
            fVar125 = fVar125 * fVar125 * fVar138 * -0.5 * fVar125 + fVar125 * 1.5;
            auVar268 = insertps(auVar258,ZEXT416((uint)(fVar120 * fVar125)),0x30);
            auVar257 = auVar268._0_12_;
            auVar268 = insertps(auVar46,ZEXT416((uint)(fVar121 * fVar125)),0x30);
            auVar44 = auVar268._0_12_;
            auVar81._0_4_ = fVar125 * fVar124;
            auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
            auVar268 = insertps(auVar107,auVar81,0x30);
            auVar228 = auVar268._0_12_;
            auVar268 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
            auVar268 = insertps(auVar268,ZEXT416((uint)(fVar122 * fVar125)),0x30);
            v_15.field_0._0_12_ = auVar268._0_12_;
          }
          else {
            auVar257 = auVar256;
            if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar7[1].ptr_ofs;
              lVar13 = uVar15 * pRVar7[1].stride;
              auVar44 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13),0);
              v_15.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10),0);
              auVar228 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20),0);
              auVar257 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30),0);
            }
          }
          fVar120 = auVar44._0_4_;
          fVar121 = auVar44._4_4_;
          fVar122 = auVar44._8_4_;
          fVar187 = 1.0 - fVar266;
          fVar193 = 1.0 - fVar280;
          fVar195 = 1.0 - fVar282;
          fVar197 = 1.0 - fVar284;
          fVar198 = fVar104 * fVar187 + fVar120 * fVar266;
          fVar211 = fVar104 * fVar193 + fVar120 * fVar280;
          fVar212 = fVar104 * fVar195 + fVar120 * fVar282;
          fVar213 = fVar104 * fVar197 + fVar120 * fVar284;
          fVar285 = fVar105 * fVar187 + fVar121 * fVar266;
          fVar294 = fVar105 * fVar193 + fVar121 * fVar280;
          fVar295 = fVar105 * fVar195 + fVar121 * fVar282;
          fVar297 = fVar105 * fVar197 + fVar121 * fVar284;
          fVar124 = fVar118 * fVar187 + fVar122 * fVar266;
          fVar138 = fVar118 * fVar193 + fVar122 * fVar280;
          fVar140 = fVar118 * fVar195 + fVar122 * fVar282;
          fVar142 = fVar118 * fVar197 + fVar122 * fVar284;
          fVar105 = v_15.field_0._0_4_;
          fVar125 = v_15.field_0._4_4_;
          fVar143 = v_15.field_0._8_4_;
          fVar104 = fVar119 * fVar187 + fVar105 * fVar266;
          fVar118 = fVar119 * fVar193 + fVar105 * fVar280;
          fVar120 = fVar119 * fVar195 + fVar105 * fVar282;
          fVar122 = fVar119 * fVar197 + fVar105 * fVar284;
          fVar105 = fVar123 * fVar187 + fVar125 * fVar266;
          fVar119 = fVar123 * fVar193 + fVar125 * fVar280;
          fVar121 = fVar123 * fVar195 + fVar125 * fVar282;
          fVar123 = fVar123 * fVar197 + fVar125 * fVar284;
          fVar125 = auVar256._8_4_ * fVar187 + fVar143 * fVar266;
          fVar139 = auVar256._8_4_ * fVar193 + fVar143 * fVar280;
          fVar141 = auVar256._8_4_ * fVar195 + fVar143 * fVar282;
          fVar143 = auVar256._8_4_ * fVar197 + fVar143 * fVar284;
          fVar226 = auVar228._0_4_;
          fVar227 = auVar228._4_4_;
          fVar237 = auVar228._8_4_;
          fVar144 = fVar186 * fVar187 + fVar226 * fVar266;
          fVar184 = fVar186 * fVar193 + fVar226 * fVar280;
          fVar185 = fVar186 * fVar195 + fVar226 * fVar282;
          fVar186 = fVar186 * fVar197 + fVar226 * fVar284;
          fVar301 = fVar194 * fVar187 + fVar227 * fVar266;
          fVar310 = fVar194 * fVar193 + fVar227 * fVar280;
          fVar314 = fVar194 * fVar195 + fVar227 * fVar282;
          fVar317 = fVar194 * fVar197 + fVar227 * fVar284;
          fVar194 = auVar257._0_4_;
          fVar242 = auVar257._4_4_;
          fVar311 = auVar257._8_4_;
          fVar243 = fVar196 * fVar187 + fVar237 * fVar266;
          fVar251 = fVar196 * fVar193 + fVar237 * fVar280;
          fVar253 = fVar196 * fVar195 + fVar237 * fVar282;
          fVar254 = fVar196 * fVar197 + fVar237 * fVar284;
          fVar226 = fVar78 * fVar187 + fVar194 * fVar266;
          fVar237 = fVar78 * fVar193 + fVar194 * fVar280;
          fVar239 = fVar78 * fVar195 + fVar194 * fVar282;
          fVar241 = fVar78 * fVar197 + fVar194 * fVar284;
          fVar227 = fVar188 * fVar187 + fVar242 * fVar266;
          fVar238 = fVar188 * fVar193 + fVar242 * fVar280;
          fVar240 = fVar188 * fVar195 + fVar242 * fVar282;
          fVar242 = fVar188 * fVar197 + fVar242 * fVar284;
          fVar188 = fVar187 * fVar252 + fVar311 * fVar266;
          fVar194 = fVar193 * fVar252 + fVar311 * fVar280;
          fVar196 = fVar195 * fVar252 + fVar311 * fVar282;
          fVar187 = fVar197 * fVar252 + fVar311 * fVar284;
          fVar266 = fVar105 * fVar243 - fVar125 * fVar301;
          fVar280 = fVar119 * fVar251 - fVar139 * fVar310;
          auVar128._4_4_ = fVar280;
          auVar128._0_4_ = fVar266;
          fVar282 = fVar121 * fVar253 - fVar141 * fVar314;
          fVar284 = fVar123 * fVar254 - fVar143 * fVar317;
          auVar216._0_4_ = fVar125 * fVar144 - fVar104 * fVar243;
          auVar216._4_4_ = fVar139 * fVar184 - fVar118 * fVar251;
          auVar216._8_4_ = fVar141 * fVar185 - fVar120 * fVar253;
          auVar216._12_4_ = fVar143 * fVar186 - fVar122 * fVar254;
          auVar270._0_4_ = fVar104 * fVar301 - fVar105 * fVar144;
          auVar270._4_4_ = fVar118 * fVar310 - fVar119 * fVar184;
          auVar270._8_4_ = fVar120 * fVar314 - fVar121 * fVar185;
          auVar270._12_4_ = fVar122 * fVar317 - fVar123 * fVar186;
          auVar259._0_4_ = fVar124 * fVar301 - fVar285 * fVar243;
          auVar259._4_4_ = fVar138 * fVar310 - fVar294 * fVar251;
          auVar259._8_4_ = fVar140 * fVar314 - fVar295 * fVar253;
          auVar259._12_4_ = fVar142 * fVar317 - fVar297 * fVar254;
          auVar246._0_4_ = fVar243 * fVar198 - fVar124 * fVar144;
          auVar246._4_4_ = fVar251 * fVar211 - fVar138 * fVar184;
          auVar246._8_4_ = fVar253 * fVar212 - fVar140 * fVar185;
          auVar246._12_4_ = fVar254 * fVar213 - fVar142 * fVar186;
          auVar146._0_4_ = fVar144 * fVar285 - fVar301 * fVar198;
          auVar146._4_4_ = fVar184 * fVar294 - fVar310 * fVar211;
          auVar146._8_4_ = fVar185 * fVar295 - fVar314 * fVar212;
          auVar146._12_4_ = fVar186 * fVar297 - fVar317 * fVar213;
          auVar303._0_4_ = fVar285 * fVar125 - fVar124 * fVar105;
          auVar303._4_4_ = fVar294 * fVar139 - fVar138 * fVar119;
          auVar303._8_4_ = fVar295 * fVar141 - fVar140 * fVar121;
          auVar303._12_4_ = fVar297 * fVar143 - fVar142 * fVar123;
          auVar321._0_4_ = fVar124 * fVar104 - fVar125 * fVar198;
          auVar321._4_4_ = fVar138 * fVar118 - fVar139 * fVar211;
          auVar321._8_4_ = fVar140 * fVar120 - fVar141 * fVar212;
          auVar321._12_4_ = fVar142 * fVar122 - fVar143 * fVar213;
          auVar106._0_4_ = fVar105 * fVar198 - fVar104 * fVar285;
          auVar106._4_4_ = fVar119 * fVar211 - fVar118 * fVar294;
          auVar106._8_4_ = fVar121 * fVar212 - fVar120 * fVar295;
          auVar106._12_4_ = fVar123 * fVar213 - fVar122 * fVar297;
          auVar199._0_4_ = fVar198 * fVar266 + fVar285 * auVar216._0_4_ + fVar124 * auVar270._0_4_;
          auVar199._4_4_ = fVar211 * fVar280 + fVar294 * auVar216._4_4_ + fVar138 * auVar270._4_4_;
          auVar199._8_4_ = fVar212 * fVar282 + fVar295 * auVar216._8_4_ + fVar140 * auVar270._8_4_;
          auVar199._12_4_ =
               fVar213 * fVar284 + fVar297 * auVar216._12_4_ + fVar142 * auVar270._12_4_;
          auVar128._8_4_ = fVar282;
          auVar128._12_4_ = fVar284;
          auVar129 = divps(auVar128,auVar199);
          auVar260 = divps(auVar259,auVar199);
          auVar304 = divps(auVar303,auVar199);
          auVar217 = divps(auVar216,auVar199);
          _local_298 = divps(auVar246,auVar199);
          auVar322 = divps(auVar321,auVar199);
          auVar268 = divps(auVar270,auVar199);
          _local_288 = divps(auVar146,auVar199);
          auVar107 = divps(auVar106,auVar199);
          fVar266 = fVar226 * auVar129._0_4_ + fVar227 * auVar217._0_4_ + fVar188 * auVar268._0_4_;
          fVar280 = fVar237 * auVar129._4_4_ + fVar238 * auVar217._4_4_ + fVar194 * auVar268._4_4_;
          fVar282 = fVar239 * auVar129._8_4_ + fVar240 * auVar217._8_4_ + fVar196 * auVar268._8_4_;
          fVar284 = fVar241 * auVar129._12_4_ +
                    fVar242 * auVar217._12_4_ + fVar187 * auVar268._12_4_;
          fVar104 = fVar226 * auVar260._0_4_ + fVar227 * local_298._0_4_ + fVar188 * local_288._0_4_
          ;
          fVar105 = fVar237 * auVar260._4_4_ + fVar238 * local_298._4_4_ + fVar194 * local_288._4_4_
          ;
          fVar118 = fVar239 * auVar260._8_4_ + fVar240 * local_298._8_4_ + fVar196 * local_288._8_4_
          ;
          fVar78 = fVar241 * auVar260._12_4_ +
                   fVar242 * local_298._12_4_ + fVar187 * local_288._12_4_;
          fVar188 = fVar226 * auVar304._0_4_ + fVar227 * auVar322._0_4_ + fVar188 * auVar107._0_4_;
          fVar252 = fVar237 * auVar304._4_4_ + fVar238 * auVar322._4_4_ + fVar194 * auVar107._4_4_;
          fVar186 = fVar239 * auVar304._8_4_ + fVar240 * auVar322._8_4_ + fVar196 * auVar107._8_4_;
          fVar194 = fVar241 * auVar304._12_4_ +
                    fVar242 * auVar322._12_4_ + fVar187 * auVar107._12_4_;
        }
        else {
          while( true ) {
            uVar10 = movmskps((int)pRVar11,auVar268);
            if (uVar10 == 0) break;
            lVar13 = 0;
            if ((uVar10 & 0xff) != 0) {
              for (; ((uVar10 & 0xff) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            iVar12 = *(int *)((long)&local_68 + (long)(int)lVar13 * 4);
            auVar18._0_4_ = -(uint)(iVar12 == iVar300);
            auVar18._4_4_ = -(uint)(iVar12 == iVar309);
            auVar18._8_4_ = -(uint)(iVar12 == iVar313);
            auVar18._12_4_ = -(uint)(iVar12 == iVar316);
            auVar18 = auVar18 & auVar268;
            pRVar7 = (this->l2w_buf).items;
            pRVar11 = pRVar7 + iVar12;
            RVar3 = pRVar7[iVar12].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x10),0x1c);
              in_XMM13 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x20),0x28);
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 4)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x14),0x1c);
              in_XMM9 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x24),0x28);
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 8)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x18),0x1c);
              _local_288 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x28),0x28);
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 0x1c),0x1c);
              in_XMM7 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x2c),0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              in_XMM13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 4);
              in_XMM13._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
              in_XMM13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 4) >> 0x20);
              in_XMM13._12_4_ = 0;
              in_XMM9._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x10);
              in_XMM9._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0xc);
              in_XMM9._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x10) >> 0x20);
              in_XMM9._12_4_ = 0;
              local_288._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
              local_288._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
              fStack_280 = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
              fStack_27c = 0.0;
              in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x28);
              in_XMM7._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x24);
              in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x28) >> 0x20);
              in_XMM7._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              auVar271._8_8_ = 0;
              auVar271._0_8_ = *(ulong *)(pcVar6 + lVar13 + 0x10);
              auVar217 = insertps(auVar271,*(undefined4 *)(pcVar6 + lVar13 + 8),0x20);
              auVar287._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x34);
              auVar287._0_4_ = *(undefined4 *)(pcVar6 + lVar13);
              auVar287._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x34) >> 0x20);
              auVar287._12_4_ = 0;
              auVar200._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar13 + 0x1c);
              auVar200._0_4_ = *(undefined4 *)(pcVar6 + lVar13 + 0x18);
              auVar200._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar13 + 0x1c) >> 0x20);
              auVar200._12_4_ = 0;
              fVar104 = *(float *)(pcVar6 + lVar13 + 0x24);
              fVar105 = *(float *)(pcVar6 + lVar13 + 0x28);
              fVar118 = *(float *)(pcVar6 + lVar13 + 0x2c);
              fVar78 = *(float *)(pcVar6 + lVar13 + 0x30);
              fVar252 = fVar78 * fVar78 + fVar118 * fVar118 + fVar104 * fVar104 + fVar105 * fVar105;
              auVar129 = rsqrtss(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252));
              fVar188 = auVar129._0_4_;
              fVar188 = fVar188 * fVar188 * fVar252 * -0.5 * fVar188 + fVar188 * 1.5;
              in_XMM7 = insertps(auVar200,ZEXT416((uint)(fVar104 * fVar188)),0x30);
              in_XMM13 = insertps(auVar287,ZEXT416((uint)(fVar105 * fVar188)),0x30);
              auVar108._0_4_ = fVar188 * fVar78;
              auVar108._4_12_ = auVar129._4_12_;
              auVar129 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                  *(undefined4 *)(pcVar6 + lVar13 + 4),0x10);
              _local_288 = insertps(auVar217,auVar108,0x30);
              auVar129 = insertps(auVar129,*(undefined4 *)(pcVar6 + lVar13 + 0x3c),0x20);
              in_XMM9 = insertps(auVar129,ZEXT416((uint)(fVar118 * fVar188)),0x30);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11->ptr_ofs;
              lVar13 = pRVar11->stride * uVar15;
              in_XMM13 = *(undefined1 (*) [16])(pcVar6 + lVar13);
              in_XMM9 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x10);
              _local_288 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x20);
              in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar13 + 0x30);
            }
            uVar79 = in_XMM13._0_4_;
            uVar101 = in_XMM13._4_4_;
            uVar102 = in_XMM13._8_4_;
            auVar47._4_4_ = uVar79;
            auVar47._0_4_ = uVar79;
            auVar47._8_4_ = uVar79;
            auVar47._12_4_ = uVar79;
            _local_248 = blendvps(_local_248,auVar47,auVar18);
            auVar48._4_4_ = uVar101;
            auVar48._0_4_ = uVar101;
            auVar48._8_4_ = uVar101;
            auVar48._12_4_ = uVar101;
            _local_158 = blendvps(_local_158,auVar48,auVar18);
            auVar49._4_4_ = uVar102;
            auVar49._0_4_ = uVar102;
            auVar49._8_4_ = uVar102;
            auVar49._12_4_ = uVar102;
            _local_258 = blendvps(_local_258,auVar49,auVar18);
            uVar79 = in_XMM9._0_4_;
            uVar101 = in_XMM9._4_4_;
            uVar102 = in_XMM9._8_4_;
            auVar50._4_4_ = uVar79;
            auVar50._0_4_ = uVar79;
            auVar50._8_4_ = uVar79;
            auVar50._12_4_ = uVar79;
            _local_268 = blendvps(_local_268,auVar50,auVar18);
            auVar51._4_4_ = uVar101;
            auVar51._0_4_ = uVar101;
            auVar51._8_4_ = uVar101;
            auVar51._12_4_ = uVar101;
            _local_238 = blendvps(_local_238,auVar51,auVar18);
            auVar52._4_4_ = uVar102;
            auVar52._0_4_ = uVar102;
            auVar52._8_4_ = uVar102;
            auVar52._12_4_ = uVar102;
            _local_1f8 = blendvps(_local_1f8,auVar52,auVar18);
            uVar79 = local_288._0_4_;
            uVar101 = local_288._4_4_;
            uVar102 = local_288._8_4_;
            auVar53._4_4_ = uVar79;
            auVar53._0_4_ = uVar79;
            auVar53._8_4_ = uVar79;
            auVar53._12_4_ = uVar79;
            auVar107 = blendvps(auVar107,auVar53,auVar18);
            auVar54._4_4_ = uVar101;
            auVar54._0_4_ = uVar101;
            auVar54._8_4_ = uVar101;
            auVar54._12_4_ = uVar101;
            _local_1a8 = blendvps(_local_1a8,auVar54,auVar18);
            auVar55._4_4_ = uVar102;
            auVar55._0_4_ = uVar102;
            auVar55._8_4_ = uVar102;
            auVar55._12_4_ = uVar102;
            in_XMM4 = blendvps(in_XMM4,auVar55,auVar18);
            uVar79 = in_XMM7._0_4_;
            uVar101 = in_XMM7._4_4_;
            uVar102 = in_XMM7._8_4_;
            auVar56._4_4_ = uVar79;
            auVar56._0_4_ = uVar79;
            auVar56._8_4_ = uVar79;
            auVar56._12_4_ = uVar79;
            auVar109 = blendvps(auVar109,auVar56,auVar18);
            auVar57._4_4_ = uVar101;
            auVar57._0_4_ = uVar101;
            auVar57._8_4_ = uVar101;
            auVar57._12_4_ = uVar101;
            in_XMM6 = blendvps(in_XMM6,auVar57,auVar18);
            auVar58._4_4_ = uVar102;
            auVar58._0_4_ = uVar102;
            auVar58._8_4_ = uVar102;
            auVar58._12_4_ = uVar102;
            _local_278 = blendvps(_local_278,auVar58,auVar18);
            RVar3 = pRVar11[1].format;
            if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->ptr_ofs + (long)pcVar6)),
                                  *(undefined4 *)((long)&pRVar11->stride + (long)pcVar6),0x1c);
              _local_298 = insertps(auVar129,*(undefined4 *)((long)&pRVar11->format + (long)pcVar6),
                                    0x28);
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->stride + (long)(pcVar6 + 4)),0x1c)
              ;
              in_XMM11 = insertps(auVar129,*(undefined4 *)
                                            ((long)&pRVar11->modCounter + (long)pcVar6),0x28);
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)pcVar6)),
                                  *(undefined4 *)((long)&pRVar11->num + (long)pcVar6),0x1c);
              in_XMM10 = insertps(auVar129,*(undefined4 *)(&pRVar11->modified + (long)pcVar6),0x28);
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->num + (long)(pcVar6 + 4)),0x1c);
              in_XMM8 = insertps(auVar129,*(undefined4 *)((long)&pRVar11->userData + (long)pcVar6),
                                 0x28);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              uVar2 = *(undefined8 *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4));
              local_298._4_4_ = (int)uVar2;
              local_298._0_4_ = *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)pcVar6);
              fStack_290 = (float)(int)((ulong)uVar2 >> 0x20);
              fStack_28c = 0.0;
              uVar2 = *(undefined8 *)((long)&pRVar11->stride + (long)pcVar6);
              in_XMM11._4_4_ = (int)uVar2;
              in_XMM11._0_4_ = *(undefined4 *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4));
              in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM11._12_4_ = 0;
              uVar2 = *(undefined8 *)((long)&pRVar11->num + (long)(pcVar6 + 4));
              in_XMM10._4_4_ = (int)uVar2;
              in_XMM10._0_4_ = *(undefined4 *)((long)&pRVar11->num + (long)pcVar6);
              in_XMM10._8_4_ = (int)((ulong)uVar2 >> 0x20);
              in_XMM10._12_4_ = 0;
              in_XMM8._4_4_ = (int)*(undefined8 *)(&pRVar11->modified + (long)pcVar6);
              in_XMM8._0_4_ = *(undefined4 *)((long)&pRVar11->modCounter + (long)pcVar6);
              in_XMM8._8_4_ =
                   (int)((ulong)*(undefined8 *)(&pRVar11->modified + (long)pcVar6) >> 0x20);
              in_XMM8._12_4_ = 0;
            }
            else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              auVar272._8_8_ = 0;
              auVar272._0_8_ = *(ulong *)((long)&pRVar11->stride + (long)pcVar6);
              auVar217 = insertps(auVar272,*(undefined4 *)((long)&pRVar11->dptr_ofs + (long)pcVar6),
                                  0x20);
              auVar82._4_4_ = (int)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar11->buffer).ptr);
              auVar82._0_4_ = *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)pcVar6);
              uVar2 = *(undefined8 *)((long)&pRVar11->num + (long)(pcVar6 + 4));
              auVar218._4_4_ = (int)uVar2;
              auVar218._0_4_ = *(undefined4 *)((long)&pRVar11->num + (long)pcVar6);
              auVar218._8_4_ = (int)((ulong)uVar2 >> 0x20);
              auVar218._12_4_ = 0;
              fVar104 = *(float *)((long)&pRVar11->modCounter + (long)pcVar6);
              fVar105 = *(float *)(&pRVar11->modified + (long)pcVar6);
              fVar118 = *(float *)((long)&pRVar11->userData + (long)pcVar6);
              fVar78 = *(float *)(pcVar6 + (long)&(pRVar11->buffer).ptr);
              fVar252 = fVar78 * fVar78 + fVar118 * fVar118 + fVar104 * fVar104 + fVar105 * fVar105;
              auVar129 = rsqrtss(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252));
              fVar188 = auVar129._0_4_;
              fVar188 = fVar188 * fVar188 * fVar252 * -0.5 * fVar188 + fVar188 * 1.5;
              in_XMM8 = insertps(auVar218,ZEXT416((uint)(fVar104 * fVar188)),0x30);
              auVar82._8_4_ =
                   (int)((ulong)*(undefined8 *)(pcVar6 + 4 + (long)&(pRVar11->buffer).ptr) >> 0x20);
              auVar82._12_4_ = 0;
              _local_298 = insertps(auVar82,ZEXT416((uint)(fVar105 * fVar188)),0x30);
              auVar130._0_4_ = fVar188 * fVar78;
              auVar130._4_12_ = auVar129._4_12_;
              auVar129 = insertps(ZEXT416(*(uint *)((long)&pRVar11->dptr_ofs + (long)(pcVar6 + 4))),
                                  *(undefined4 *)((long)&pRVar11->ptr_ofs + (long)(pcVar6 + 4)),0x10
                                 );
              in_XMM10 = insertps(auVar217,auVar130,0x30);
              auVar129 = insertps(auVar129,*(undefined4 *)
                                            ((long)&pRVar11[1].ptr_ofs + (long)(pcVar6 + 4)),0x20);
              in_XMM11 = insertps(auVar129,ZEXT416((uint)(fVar118 * fVar188)),0x30);
            }
            else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar6 = pRVar11[1].ptr_ofs;
              pRVar11 = (RawBufferView *)(pRVar11[1].stride * uVar15);
              _local_298 = *(undefined1 (*) [16])((long)&pRVar11->ptr_ofs + (long)pcVar6);
              in_XMM11 = *(undefined1 (*) [16])((long)&pRVar11->stride + (long)pcVar6);
              in_XMM10 = *(undefined1 (*) [16])((long)&pRVar11->format + (long)pcVar6);
              in_XMM8 = *(undefined1 (*) [16])(pcVar6 + (long)&(pRVar11->buffer).ptr);
            }
            uVar79 = local_298._0_4_;
            uVar101 = local_298._4_4_;
            uVar102 = local_298._8_4_;
            auVar59._4_4_ = uVar79;
            auVar59._0_4_ = uVar79;
            auVar59._8_4_ = uVar79;
            auVar59._12_4_ = uVar79;
            _local_148 = blendvps(_local_148,auVar59,auVar18);
            auVar60._4_4_ = uVar101;
            auVar60._0_4_ = uVar101;
            auVar60._8_4_ = uVar101;
            auVar60._12_4_ = uVar101;
            _local_138 = blendvps(_local_138,auVar60,auVar18);
            uVar103 = in_XMM10._0_4_;
            uVar281 = in_XMM10._4_4_;
            uVar283 = in_XMM10._8_4_;
            auVar61._4_4_ = uVar102;
            auVar61._0_4_ = uVar102;
            auVar61._8_4_ = uVar102;
            auVar61._12_4_ = uVar102;
            _local_168 = blendvps(_local_168,auVar61,auVar18);
            uVar79 = in_XMM11._0_4_;
            uVar101 = in_XMM11._4_4_;
            uVar102 = in_XMM11._8_4_;
            auVar62._4_4_ = uVar79;
            auVar62._0_4_ = uVar79;
            auVar62._8_4_ = uVar79;
            auVar62._12_4_ = uVar79;
            _local_198 = blendvps(_local_198,auVar62,auVar18);
            auVar63._4_4_ = uVar101;
            auVar63._0_4_ = uVar101;
            auVar63._8_4_ = uVar101;
            auVar63._12_4_ = uVar101;
            _local_1e8 = blendvps(_local_1e8,auVar63,auVar18);
            auVar64._4_4_ = uVar102;
            auVar64._0_4_ = uVar102;
            auVar64._8_4_ = uVar102;
            auVar64._12_4_ = uVar102;
            _local_128 = blendvps(_local_128,auVar64,auVar18);
            auVar65._4_4_ = uVar103;
            auVar65._0_4_ = uVar103;
            auVar65._8_4_ = uVar103;
            auVar65._12_4_ = uVar103;
            _local_208 = blendvps(_local_208,auVar65,auVar18);
            auVar66._4_4_ = uVar281;
            auVar66._0_4_ = uVar281;
            auVar66._8_4_ = uVar281;
            auVar66._12_4_ = uVar281;
            _local_228 = blendvps(_local_228,auVar66,auVar18);
            auVar67._4_4_ = uVar283;
            auVar67._0_4_ = uVar283;
            auVar67._8_4_ = uVar283;
            auVar67._12_4_ = uVar283;
            _local_218 = blendvps(_local_218,auVar67,auVar18);
            uVar79 = in_XMM8._0_4_;
            uVar101 = in_XMM8._4_4_;
            uVar102 = in_XMM8._8_4_;
            auVar68._4_4_ = uVar79;
            auVar68._0_4_ = uVar79;
            auVar68._8_4_ = uVar79;
            auVar68._12_4_ = uVar79;
            _local_1d8 = blendvps(_local_1d8,auVar68,auVar18);
            auVar69._4_4_ = uVar101;
            auVar69._0_4_ = uVar101;
            auVar69._8_4_ = uVar101;
            auVar69._12_4_ = uVar101;
            _local_1c8 = blendvps(_local_1c8,auVar69,auVar18);
            auVar70._4_4_ = uVar102;
            auVar70._0_4_ = uVar102;
            auVar70._8_4_ = uVar102;
            auVar70._12_4_ = uVar102;
            _local_1b8 = blendvps(_local_1b8,auVar70,auVar18);
            auVar268 = auVar268 ^ auVar18;
          }
          fVar104 = 1.0 - fVar266;
          fVar105 = 1.0 - fVar280;
          fVar118 = 1.0 - fVar282;
          fVar78 = 1.0 - fVar284;
          fVar295 = (float)local_248._0_4_ * fVar104 + (float)local_148._0_4_ * fVar266;
          fVar297 = (float)local_248._4_4_ * fVar105 + (float)local_148._4_4_ * fVar280;
          fVar301 = (float)uStack_240 * fVar118 + fStack_140 * fVar282;
          fVar310 = uStack_240._4_4_ * fVar78 + fStack_13c * fVar284;
          fVar197 = (float)local_158._0_4_ * fVar104 + (float)local_138._0_4_ * fVar266;
          fVar198 = (float)local_158._4_4_ * fVar105 + (float)local_138._4_4_ * fVar280;
          fVar211 = fStack_150 * fVar118 + fStack_130 * fVar282;
          fVar212 = fStack_14c * fVar78 + fStack_12c * fVar284;
          fVar185 = (float)local_258._0_4_ * fVar104 + (float)local_168._0_4_ * fVar266;
          fVar187 = (float)local_258._4_4_ * fVar105 + (float)local_168._4_4_ * fVar280;
          fVar193 = (float)uStack_250 * fVar118 + fStack_160 * fVar282;
          fVar195 = uStack_250._4_4_ * fVar78 + fStack_15c * fVar284;
          fVar213 = (float)local_268._0_4_ * fVar104 + (float)local_198._0_4_ * fVar266;
          fVar226 = (float)local_268._4_4_ * fVar105 + (float)local_198._4_4_ * fVar280;
          fVar227 = (float)uStack_260 * fVar118 + fStack_190 * fVar282;
          fVar237 = uStack_260._4_4_ * fVar78 + fStack_18c * fVar284;
          fVar242 = (float)local_238._0_4_ * fVar104 + (float)local_1e8._0_4_ * fVar266;
          fVar243 = (float)local_238._4_4_ * fVar105 + (float)local_1e8._4_4_ * fVar280;
          fVar251 = (float)uStack_230 * fVar118 + fStack_1e0 * fVar282;
          fVar253 = uStack_230._4_4_ * fVar78 + fStack_1dc * fVar284;
          fVar121 = (float)local_1f8._0_4_ * fVar104 + (float)local_128._0_4_ * fVar266;
          fVar122 = (float)local_1f8._4_4_ * fVar105 + (float)local_128._4_4_ * fVar280;
          fVar124 = (float)uStack_1f0 * fVar118 + fStack_120 * fVar282;
          fVar125 = uStack_1f0._4_4_ * fVar78 + fStack_11c * fVar284;
          fVar138 = auVar107._0_4_ * fVar104 + (float)local_208._0_4_ * fVar266;
          fVar139 = auVar107._4_4_ * fVar105 + (float)local_208._4_4_ * fVar280;
          fVar140 = auVar107._8_4_ * fVar118 + fStack_200 * fVar282;
          fVar141 = auVar107._12_4_ * fVar78 + fStack_1fc * fVar284;
          fVar254 = (float)local_1a8._0_4_ * fVar104 + (float)local_228._0_4_ * fVar266;
          fVar311 = (float)local_1a8._4_4_ * fVar105 + (float)local_228._4_4_ * fVar280;
          fVar285 = fStack_1a0 * fVar118 + fStack_220 * fVar282;
          fVar294 = fStack_19c * fVar78 + fStack_21c * fVar284;
          fVar238 = in_XMM4._0_4_ * fVar104 + (float)local_218._0_4_ * fVar266;
          fVar239 = in_XMM4._4_4_ * fVar105 + (float)local_218._4_4_ * fVar280;
          fVar240 = in_XMM4._8_4_ * fVar118 + fStack_210 * fVar282;
          fVar241 = in_XMM4._12_4_ * fVar78 + fStack_20c * fVar284;
          fVar196 = auVar109._0_4_ * fVar104 + (float)local_1d8._0_4_ * fVar266;
          fVar119 = auVar109._4_4_ * fVar105 + (float)local_1d8._4_4_ * fVar280;
          fVar123 = auVar109._8_4_ * fVar118 + fStack_1d0 * fVar282;
          fVar120 = auVar109._12_4_ * fVar78 + fStack_1cc * fVar284;
          fVar142 = in_XMM6._0_4_ * fVar104 + (float)local_1c8._0_4_ * fVar266;
          fVar143 = in_XMM6._4_4_ * fVar105 + (float)local_1c8._4_4_ * fVar280;
          fVar144 = in_XMM6._8_4_ * fVar118 + fStack_1c0 * fVar282;
          fVar184 = in_XMM6._12_4_ * fVar78 + fStack_1bc * fVar284;
          fVar188 = fVar104 * (float)local_278._0_4_ + (float)local_1b8._0_4_ * fVar266;
          fVar252 = fVar105 * (float)local_278._4_4_ + (float)local_1b8._4_4_ * fVar280;
          fVar186 = fVar118 * fStack_270 + fStack_1b0 * fVar282;
          fVar194 = fVar78 * fStack_26c + fStack_1ac * fVar284;
          fVar266 = fVar242 * fVar238 - fVar121 * fVar254;
          fVar280 = fVar243 * fVar239 - fVar122 * fVar311;
          auVar131._4_4_ = fVar280;
          auVar131._0_4_ = fVar266;
          fVar282 = fVar251 * fVar240 - fVar124 * fVar285;
          fVar284 = fVar253 * fVar241 - fVar125 * fVar294;
          auVar219._0_4_ = fVar121 * fVar138 - fVar213 * fVar238;
          auVar219._4_4_ = fVar122 * fVar139 - fVar226 * fVar239;
          auVar219._8_4_ = fVar124 * fVar140 - fVar227 * fVar240;
          auVar219._12_4_ = fVar125 * fVar141 - fVar237 * fVar241;
          local_2a8._0_4_ = fVar213 * fVar254 - fVar242 * fVar138;
          local_2a8._4_4_ = fVar226 * fVar311 - fVar243 * fVar139;
          uStack_2a0._0_4_ = fVar227 * fVar285 - fVar251 * fVar140;
          uStack_2a0._4_4_ = fVar237 * fVar294 - fVar253 * fVar141;
          auVar230._0_4_ = fVar185 * fVar254 - fVar197 * fVar238;
          auVar230._4_4_ = fVar187 * fVar311 - fVar198 * fVar239;
          auVar230._8_4_ = fVar193 * fVar285 - fVar211 * fVar240;
          auVar230._12_4_ = fVar195 * fVar294 - fVar212 * fVar241;
          auVar201._0_4_ = fVar238 * fVar295 - fVar185 * fVar138;
          auVar201._4_4_ = fVar239 * fVar297 - fVar187 * fVar139;
          auVar201._8_4_ = fVar240 * fVar301 - fVar193 * fVar140;
          auVar201._12_4_ = fVar241 * fVar310 - fVar195 * fVar141;
          auVar273._0_4_ = fVar138 * fVar197 - fVar254 * fVar295;
          auVar273._4_4_ = fVar139 * fVar198 - fVar311 * fVar297;
          auVar273._8_4_ = fVar140 * fVar211 - fVar285 * fVar301;
          auVar273._12_4_ = fVar141 * fVar212 - fVar294 * fVar310;
          auVar305._0_4_ = fVar197 * fVar121 - fVar185 * fVar242;
          auVar305._4_4_ = fVar198 * fVar122 - fVar187 * fVar243;
          auVar305._8_4_ = fVar211 * fVar124 - fVar193 * fVar251;
          auVar305._12_4_ = fVar212 * fVar125 - fVar195 * fVar253;
          auVar323._0_4_ = fVar185 * fVar213 - fVar121 * fVar295;
          auVar323._4_4_ = fVar187 * fVar226 - fVar122 * fVar297;
          auVar323._8_4_ = fVar193 * fVar227 - fVar124 * fVar301;
          auVar323._12_4_ = fVar195 * fVar237 - fVar125 * fVar310;
          auVar131._8_4_ = fVar282;
          auVar131._12_4_ = fVar284;
          auVar288._0_4_ = fVar242 * fVar295 - fVar213 * fVar197;
          auVar288._4_4_ = fVar243 * fVar297 - fVar226 * fVar198;
          auVar288._8_4_ = fVar251 * fVar301 - fVar227 * fVar211;
          auVar288._12_4_ = fVar253 * fVar310 - fVar237 * fVar212;
          auVar71._0_4_ =
               fVar295 * fVar266 + fVar197 * auVar219._0_4_ + fVar185 * (float)local_2a8._0_4_;
          auVar71._4_4_ =
               fVar297 * fVar280 + fVar198 * auVar219._4_4_ + fVar187 * (float)local_2a8._4_4_;
          auVar71._8_4_ = fVar301 * fVar282 + fVar211 * auVar219._8_4_ + fVar193 * (float)uStack_2a0
          ;
          auVar71._12_4_ =
               fVar310 * fVar284 + fVar212 * auVar219._12_4_ + fVar195 * uStack_2a0._4_4_;
          auVar129 = divps(auVar131,auVar71);
          auVar260 = divps(auVar230,auVar71);
          auVar304 = divps(auVar305,auVar71);
          auVar217 = divps(auVar219,auVar71);
          _local_298 = divps(auVar201,auVar71);
          auVar322 = divps(auVar323,auVar71);
          auVar268 = divps(_local_2a8,auVar71);
          _local_288 = divps(auVar273,auVar71);
          auVar107 = divps(auVar288,auVar71);
          fVar266 = fVar196 * auVar129._0_4_ + fVar142 * auVar217._0_4_ + fVar188 * auVar268._0_4_;
          fVar280 = fVar119 * auVar129._4_4_ + fVar143 * auVar217._4_4_ + fVar252 * auVar268._4_4_;
          fVar282 = fVar123 * auVar129._8_4_ + fVar144 * auVar217._8_4_ + fVar186 * auVar268._8_4_;
          fVar284 = fVar120 * auVar129._12_4_ +
                    fVar184 * auVar217._12_4_ + fVar194 * auVar268._12_4_;
          fVar104 = fVar196 * auVar260._0_4_ + fVar142 * local_298._0_4_ + fVar188 * local_288._0_4_
          ;
          fVar105 = fVar119 * auVar260._4_4_ + fVar143 * local_298._4_4_ + fVar252 * local_288._4_4_
          ;
          fVar118 = fVar123 * auVar260._8_4_ + fVar144 * local_298._8_4_ + fVar186 * local_288._8_4_
          ;
          fVar78 = fVar120 * auVar260._12_4_ +
                   fVar184 * local_298._12_4_ + fVar194 * local_288._12_4_;
          fVar188 = fVar196 * auVar304._0_4_ + fVar142 * auVar322._0_4_ + fVar188 * auVar107._0_4_;
          fVar252 = fVar119 * auVar304._4_4_ + fVar143 * auVar322._4_4_ + fVar252 * auVar107._4_4_;
          fVar186 = fVar123 * auVar304._8_4_ + fVar144 * auVar322._8_4_ + fVar186 * auVar107._8_4_;
          fVar194 = fVar120 * auVar304._12_4_ +
                    fVar184 * auVar322._12_4_ + fVar194 * auVar107._12_4_;
        }
      }
      pRVar1 = ray + 0x10;
      fVar196 = *(float *)pRVar1;
      fVar119 = *(float *)(ray + 0x14);
      fVar123 = *(float *)(ray + 0x18);
      auVar126 = *(undefined1 (*) [12])pRVar1;
      fVar120 = *(float *)(ray + 0x1c);
      auVar325 = *(undefined1 (*) [16])pRVar1;
      pRVar1 = ray + 0x20;
      fVar121 = *(float *)pRVar1;
      fVar122 = *(float *)(ray + 0x24);
      fVar124 = *(float *)(ray + 0x28);
      auVar255 = *(undefined1 (*) [12])pRVar1;
      fVar125 = *(float *)(ray + 0x2c);
      auVar28 = *(undefined1 (*) [16])pRVar1;
      fVar138 = *(float *)ray;
      fVar139 = *(float *)(ray + 4);
      fVar140 = *(float *)(ray + 8);
      auVar244 = *(undefined1 (*) [12])ray;
      fVar141 = *(float *)(ray + 0xc);
      auVar73 = *(undefined1 (*) [16])ray;
      pRVar1 = ray + 0x40;
      fVar142 = *(float *)pRVar1;
      fVar143 = *(float *)(ray + 0x44);
      fVar144 = *(float *)(ray + 0x48);
      auVar44 = *(undefined1 (*) [12])pRVar1;
      fVar184 = *(float *)(ray + 0x4c);
      auVar291 = *(undefined1 (*) [16])pRVar1;
      pRVar1 = ray + 0x50;
      fVar185 = *(float *)pRVar1;
      fVar187 = *(float *)(ray + 0x54);
      fVar193 = *(float *)(ray + 0x58);
      auVar228 = *(undefined1 (*) [12])pRVar1;
      fVar195 = *(float *)(ray + 0x5c);
      auVar277 = *(undefined1 (*) [16])pRVar1;
      pRVar1 = ray + 0x60;
      fVar197 = *(float *)pRVar1;
      fVar198 = *(float *)(ray + 100);
      fVar211 = *(float *)(ray + 0x68);
      auVar214 = *(undefined1 (*) [12])pRVar1;
      fVar212 = *(float *)(ray + 0x6c);
      auVar224 = *(undefined1 (*) [16])pRVar1;
      *(float *)ray =
           auVar129._0_4_ * fVar138 + auVar217._0_4_ * fVar196 + auVar268._0_4_ * fVar121 + -fVar266
      ;
      *(float *)(ray + 4) =
           auVar129._4_4_ * fVar139 + auVar217._4_4_ * fVar119 + auVar268._4_4_ * fVar122 + -fVar280
      ;
      *(float *)(ray + 8) =
           auVar129._8_4_ * fVar140 + auVar217._8_4_ * fVar123 + auVar268._8_4_ * fVar124 + -fVar282
      ;
      *(float *)(ray + 0xc) =
           auVar129._12_4_ * fVar141 +
           auVar217._12_4_ * fVar120 + auVar268._12_4_ * fVar125 + -fVar284;
      *(float *)(ray + 0x10) =
           auVar260._0_4_ * fVar138 +
           (float)local_298._0_4_ * fVar196 + (float)local_288._0_4_ * fVar121 + -fVar104;
      *(float *)(ray + 0x14) =
           auVar260._4_4_ * fVar139 +
           (float)local_298._4_4_ * fVar119 + (float)local_288._4_4_ * fVar122 + -fVar105;
      *(float *)(ray + 0x18) =
           auVar260._8_4_ * fVar140 + fStack_290 * fVar123 + fStack_280 * fVar124 + -fVar118;
      *(float *)(ray + 0x1c) =
           auVar260._12_4_ * fVar141 + fStack_28c * fVar120 + fStack_27c * fVar125 + -fVar78;
      *(float *)(ray + 0x20) =
           auVar304._0_4_ * fVar138 + auVar322._0_4_ * fVar196 + auVar107._0_4_ * fVar121 + -fVar188
      ;
      *(float *)(ray + 0x24) =
           auVar304._4_4_ * fVar139 + auVar322._4_4_ * fVar119 + auVar107._4_4_ * fVar122 + -fVar252
      ;
      *(float *)(ray + 0x28) =
           auVar304._8_4_ * fVar140 + auVar322._8_4_ * fVar123 + auVar107._8_4_ * fVar124 + -fVar186
      ;
      *(float *)(ray + 0x2c) =
           auVar304._12_4_ * fVar141 +
           auVar322._12_4_ * fVar120 + auVar107._12_4_ * fVar125 + -fVar194;
      *(float *)(ray + 0x40) =
           auVar129._0_4_ * fVar142 + auVar217._0_4_ * fVar185 + auVar268._0_4_ * fVar197;
      *(float *)(ray + 0x44) =
           auVar129._4_4_ * fVar143 + auVar217._4_4_ * fVar187 + auVar268._4_4_ * fVar198;
      *(float *)(ray + 0x48) =
           auVar129._8_4_ * fVar144 + auVar217._8_4_ * fVar193 + auVar268._8_4_ * fVar211;
      *(float *)(ray + 0x4c) =
           auVar129._12_4_ * fVar184 + auVar217._12_4_ * fVar195 + auVar268._12_4_ * fVar212;
      *(float *)(ray + 0x50) =
           auVar260._0_4_ * fVar142 +
           (float)local_298._0_4_ * fVar185 + (float)local_288._0_4_ * fVar197;
      *(float *)(ray + 0x54) =
           auVar260._4_4_ * fVar143 +
           (float)local_298._4_4_ * fVar187 + (float)local_288._4_4_ * fVar198;
      *(float *)(ray + 0x58) =
           auVar260._8_4_ * fVar144 + fStack_290 * fVar193 + fStack_280 * fVar211;
      *(float *)(ray + 0x5c) =
           auVar260._12_4_ * fVar184 + fStack_28c * fVar195 + fStack_27c * fVar212;
      *(float *)(ray + 0x60) =
           auVar304._0_4_ * fVar142 + auVar322._0_4_ * fVar185 + auVar107._0_4_ * fVar197;
      *(float *)(ray + 100) =
           auVar304._4_4_ * fVar143 + auVar322._4_4_ * fVar187 + auVar107._4_4_ * fVar198;
      *(float *)(ray + 0x68) =
           auVar304._8_4_ * fVar144 + auVar322._8_4_ * fVar193 + auVar107._8_4_ * fVar211;
      *(float *)(ray + 0x6c) =
           auVar304._12_4_ * fVar184 + auVar322._12_4_ * fVar195 + auVar107._12_4_ * fVar212;
      local_58 = context->args;
      local_38 = local_48._0_8_;
      uStack_30 = local_48._8_8_;
      local_68 = pAVar9;
      uStack_60 = pRVar4;
      local_48 = auVar145;
      (**(code **)&pAVar9->field_0x98)(&local_38,&(pAVar9->super_AccelData).field_0x58,ray);
      local_248 = auVar244._0_8_;
      uStack_240 = auVar73._8_8_;
      *(undefined1 (*) [8])ray = local_248;
      *(undefined8 *)(ray + 8) = uStack_240;
      local_238 = auVar126._0_8_;
      uStack_230 = auVar325._8_8_;
      *(undefined1 (*) [8])(ray + 0x10) = local_238;
      *(undefined8 *)(ray + 0x18) = uStack_230;
      local_2a8 = auVar255._0_8_;
      uStack_2a0 = auVar28._8_8_;
      *(undefined1 (*) [8])(ray + 0x20) = local_2a8;
      *(undefined8 *)(ray + 0x28) = uStack_2a0;
      local_1f8 = auVar44._0_8_;
      uStack_1f0 = auVar291._8_8_;
      *(undefined1 (*) [8])(ray + 0x40) = local_1f8;
      *(undefined8 *)(ray + 0x48) = uStack_1f0;
      local_268 = auVar228._0_8_;
      uStack_260 = auVar277._8_8_;
      *(undefined1 (*) [8])(ray + 0x50) = local_268;
      *(undefined8 *)(ray + 0x58) = uStack_260;
      local_258 = auVar214._0_8_;
      uStack_250 = auVar224._8_8_;
      *(undefined1 (*) [8])(ray + 0x60) = local_258;
      *(undefined8 *)(ray + 0x68) = uStack_250;
      pRVar4->instID[0] = 0xffffffff;
      pRVar4->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }